

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  int iVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ulong uVar78;
  byte bVar79;
  long lVar80;
  ulong uVar81;
  Geometry *pGVar82;
  uint uVar83;
  ulong uVar84;
  Geometry *geometry;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  long lVar85;
  bool bVar86;
  float fVar87;
  float fVar88;
  float fVar133;
  float fVar134;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar92 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar93 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined4 uVar141;
  undefined8 uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  float fVar151;
  float fVar152;
  float fVar162;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 in_ZMM4 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_649;
  int local_644;
  Ray *local_640;
  RayQueryContext *local_638;
  undefined1 local_630 [16];
  Precalculations *local_618;
  ulong local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  RTCFilterFunctionNArguments local_5c0;
  undefined8 local_590;
  undefined4 local_588;
  float local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  uint local_574;
  uint local_570;
  ulong local_558;
  undefined8 local_550;
  undefined8 uStack_548;
  Geometry *local_540;
  undefined8 uStack_538;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  undefined4 uStack_4dc;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  undefined1 auStack_3dc [8];
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar78 = (ulong)(byte)PVar13;
  fVar152 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar92 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar147 = fVar152 * (ray->dir).field_0.m128[0];
  fVar151 = fVar152 * auVar92._0_4_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar91);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar100 = vpmovsxbd_avx2(auVar90);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar112 = vpmovsxbd_avx2(auVar143);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar113 = vpmovsxbd_avx2(auVar9);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar111 = vpmovsxbd_avx2(auVar192);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar78 + 6);
  auVar110 = vpmovsxbd_avx2(auVar89);
  auVar110 = vcvtdq2ps_avx(auVar110);
  uVar84 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar102 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar84 + uVar78 + 6);
  auVar98 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar98);
  uVar81 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar104 = vpmovsxbd_avx2(auVar12);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar184._4_4_ = fVar147;
  auVar184._0_4_ = fVar147;
  auVar184._8_4_ = fVar147;
  auVar184._12_4_ = fVar147;
  auVar184._16_4_ = fVar147;
  auVar184._20_4_ = fVar147;
  auVar184._24_4_ = fVar147;
  auVar184._28_4_ = fVar147;
  auVar94 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar99 = ZEXT1632(CONCAT412(fVar152 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar152 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar152 * (ray->dir).field_0.m128[1],fVar147))));
  auVar95 = vpermps_avx512vl(auVar94,auVar99);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = vpermps_avx512vl(auVar96,auVar99);
  fVar147 = auVar97._0_4_;
  auVar150._0_4_ = fVar147 * auVar112._0_4_;
  fVar167 = auVar97._4_4_;
  auVar150._4_4_ = fVar167 * auVar112._4_4_;
  fVar168 = auVar97._8_4_;
  auVar150._8_4_ = fVar168 * auVar112._8_4_;
  fVar169 = auVar97._12_4_;
  auVar150._12_4_ = fVar169 * auVar112._12_4_;
  fVar162 = auVar97._16_4_;
  auVar150._16_4_ = fVar162 * auVar112._16_4_;
  fVar87 = auVar97._20_4_;
  auVar150._20_4_ = fVar87 * auVar112._20_4_;
  fVar88 = auVar97._24_4_;
  auVar150._28_36_ = in_ZMM4._28_36_;
  auVar150._24_4_ = fVar88 * auVar112._24_4_;
  auVar99._4_4_ = auVar110._4_4_ * fVar167;
  auVar99._0_4_ = auVar110._0_4_ * fVar147;
  auVar99._8_4_ = auVar110._8_4_ * fVar168;
  auVar99._12_4_ = auVar110._12_4_ * fVar169;
  auVar99._16_4_ = auVar110._16_4_ * fVar162;
  auVar99._20_4_ = auVar110._20_4_ * fVar87;
  auVar99._24_4_ = auVar110._24_4_ * fVar88;
  auVar99._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar104._4_4_ * fVar167;
  auVar98._0_4_ = auVar104._0_4_ * fVar147;
  auVar98._8_4_ = auVar104._8_4_ * fVar168;
  auVar98._12_4_ = auVar104._12_4_ * fVar169;
  auVar98._16_4_ = auVar104._16_4_ * fVar162;
  auVar98._20_4_ = auVar104._20_4_ * fVar87;
  auVar98._24_4_ = auVar104._24_4_ * fVar88;
  auVar98._28_4_ = auVar97._28_4_;
  auVar91 = vfmadd231ps_fma(auVar150._0_32_,auVar95,auVar100);
  auVar90 = vfmadd231ps_fma(auVar99,auVar95,auVar111);
  auVar143 = vfmadd231ps_fma(auVar98,auVar103,auVar95);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar184,auVar101);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar184,auVar113);
  auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar102,auVar184);
  auVar185._4_4_ = fVar151;
  auVar185._0_4_ = fVar151;
  auVar185._8_4_ = fVar151;
  auVar185._12_4_ = fVar151;
  auVar185._16_4_ = fVar151;
  auVar185._20_4_ = fVar151;
  auVar185._24_4_ = fVar151;
  auVar185._28_4_ = fVar151;
  auVar99 = ZEXT1632(CONCAT412(fVar152 * auVar92._12_4_,
                               CONCAT48(fVar152 * auVar92._8_4_,
                                        CONCAT44(fVar152 * auVar92._4_4_,fVar151))));
  auVar98 = vpermps_avx512vl(auVar94,auVar99);
  auVar99 = vpermps_avx512vl(auVar96,auVar99);
  fVar152 = auVar99._0_4_;
  fVar147 = auVar99._4_4_;
  auVar94._4_4_ = fVar147 * auVar112._4_4_;
  auVar94._0_4_ = fVar152 * auVar112._0_4_;
  fVar167 = auVar99._8_4_;
  auVar94._8_4_ = fVar167 * auVar112._8_4_;
  fVar168 = auVar99._12_4_;
  auVar94._12_4_ = fVar168 * auVar112._12_4_;
  fVar169 = auVar99._16_4_;
  auVar94._16_4_ = fVar169 * auVar112._16_4_;
  fVar162 = auVar99._20_4_;
  auVar94._20_4_ = fVar162 * auVar112._20_4_;
  fVar87 = auVar99._24_4_;
  auVar94._24_4_ = fVar87 * auVar112._24_4_;
  auVar94._28_4_ = auVar112._28_4_;
  auVar106._0_4_ = auVar110._0_4_ * fVar152;
  auVar106._4_4_ = auVar110._4_4_ * fVar147;
  auVar106._8_4_ = auVar110._8_4_ * fVar167;
  auVar106._12_4_ = auVar110._12_4_ * fVar168;
  auVar106._16_4_ = auVar110._16_4_ * fVar169;
  auVar106._20_4_ = auVar110._20_4_ * fVar162;
  auVar106._24_4_ = auVar110._24_4_ * fVar87;
  auVar106._28_4_ = 0;
  auVar110._4_4_ = auVar104._4_4_ * fVar147;
  auVar110._0_4_ = auVar104._0_4_ * fVar152;
  auVar110._8_4_ = auVar104._8_4_ * fVar167;
  auVar110._12_4_ = auVar104._12_4_ * fVar168;
  auVar110._16_4_ = auVar104._16_4_ * fVar169;
  auVar110._20_4_ = auVar104._20_4_ * fVar162;
  auVar110._24_4_ = auVar104._24_4_ * fVar87;
  auVar110._28_4_ = auVar99._28_4_;
  auVar9 = vfmadd231ps_fma(auVar94,auVar98,auVar100);
  auVar192 = vfmadd231ps_fma(auVar106,auVar98,auVar111);
  auVar89 = vfmadd231ps_fma(auVar110,auVar98,auVar103);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar185,auVar101);
  auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar185,auVar113);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar185,auVar102);
  auVar177._8_4_ = 0x7fffffff;
  auVar177._0_8_ = 0x7fffffff7fffffff;
  auVar177._12_4_ = 0x7fffffff;
  auVar177._16_4_ = 0x7fffffff;
  auVar177._20_4_ = 0x7fffffff;
  auVar177._24_4_ = 0x7fffffff;
  auVar177._28_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar177,ZEXT1632(auVar91));
  auVar108._8_4_ = 0x219392ef;
  auVar108._0_8_ = 0x219392ef219392ef;
  auVar108._12_4_ = 0x219392ef;
  auVar108._16_4_ = 0x219392ef;
  auVar108._20_4_ = 0x219392ef;
  auVar108._24_4_ = 0x219392ef;
  auVar108._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar101,auVar108,1);
  bVar86 = (bool)((byte)uVar84 & 1);
  auVar95._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar91._0_4_;
  bVar86 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar91._4_4_;
  bVar86 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar91._8_4_;
  bVar86 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar91._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(auVar177,ZEXT1632(auVar90));
  uVar84 = vcmpps_avx512vl(auVar101,auVar108,1);
  bVar86 = (bool)((byte)uVar84 & 1);
  auVar96._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar90._0_4_;
  bVar86 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar90._4_4_;
  bVar86 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar90._8_4_;
  bVar86 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar90._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(auVar177,ZEXT1632(auVar143));
  uVar84 = vcmpps_avx512vl(auVar101,auVar108,1);
  bVar86 = (bool)((byte)uVar84 & 1);
  auVar101._0_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar143._0_4_;
  bVar86 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar143._4_4_;
  bVar86 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar143._8_4_;
  bVar86 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar86 * 0x219392ef | (uint)!bVar86 * auVar143._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar100 = vrcp14ps_avx512vl(auVar95);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = &DAT_3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar91 = vfnmadd213ps_fma(auVar95,auVar100,auVar109);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar96);
  auVar90 = vfnmadd213ps_fma(auVar96,auVar100,auVar109);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar101);
  auVar143 = vfnmadd213ps_fma(auVar101,auVar100,auVar109);
  auVar143 = vfmadd132ps_fma(ZEXT1632(auVar143),auVar100,auVar100);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar9));
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar102._4_4_ = auVar91._4_4_ * auVar101._4_4_;
  auVar102._0_4_ = auVar91._0_4_ * auVar101._0_4_;
  auVar102._8_4_ = auVar91._8_4_ * auVar101._8_4_;
  auVar102._12_4_ = auVar91._12_4_ * auVar101._12_4_;
  auVar102._16_4_ = auVar101._16_4_ * 0.0;
  auVar102._20_4_ = auVar101._20_4_ * 0.0;
  auVar102._24_4_ = auVar101._24_4_ * 0.0;
  auVar102._28_4_ = auVar101._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar100);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar9));
  auVar107._0_4_ = auVar91._0_4_ * auVar101._0_4_;
  auVar107._4_4_ = auVar91._4_4_ * auVar101._4_4_;
  auVar107._8_4_ = auVar91._8_4_ * auVar101._8_4_;
  auVar107._12_4_ = auVar91._12_4_ * auVar101._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar13 * 0x10 + uVar78 * -2 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar192));
  auVar103._4_4_ = auVar90._4_4_ * auVar101._4_4_;
  auVar103._0_4_ = auVar90._0_4_ * auVar101._0_4_;
  auVar103._8_4_ = auVar90._8_4_ * auVar101._8_4_;
  auVar103._12_4_ = auVar90._12_4_ * auVar101._12_4_;
  auVar103._16_4_ = auVar101._16_4_ * 0.0;
  auVar103._20_4_ = auVar101._20_4_ * 0.0;
  auVar103._24_4_ = auVar101._24_4_ * 0.0;
  auVar103._28_4_ = auVar101._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar100);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar192));
  auVar105._0_4_ = auVar90._0_4_ * auVar101._0_4_;
  auVar105._4_4_ = auVar90._4_4_ * auVar101._4_4_;
  auVar105._8_4_ = auVar90._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar90._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar78 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar89));
  auVar104._4_4_ = auVar101._4_4_ * auVar143._4_4_;
  auVar104._0_4_ = auVar101._0_4_ * auVar143._0_4_;
  auVar104._8_4_ = auVar101._8_4_ * auVar143._8_4_;
  auVar104._12_4_ = auVar101._12_4_ * auVar143._12_4_;
  auVar104._16_4_ = auVar101._16_4_ * 0.0;
  auVar104._20_4_ = auVar101._20_4_ * 0.0;
  auVar104._24_4_ = auVar101._24_4_ * 0.0;
  auVar104._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar89));
  auVar97._0_4_ = auVar143._0_4_ * auVar101._0_4_;
  auVar97._4_4_ = auVar143._4_4_ * auVar101._4_4_;
  auVar97._8_4_ = auVar143._8_4_ * auVar101._8_4_;
  auVar97._12_4_ = auVar143._12_4_ * auVar101._12_4_;
  auVar97._16_4_ = auVar101._16_4_ * 0.0;
  auVar97._20_4_ = auVar101._20_4_ * 0.0;
  auVar97._24_4_ = auVar101._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar102,auVar107);
  auVar100 = vpminsd_avx2(auVar103,auVar105);
  auVar101 = vmaxps_avx(auVar101,auVar100);
  auVar100 = vpminsd_avx2(auVar104,auVar97);
  uVar141 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar112._4_4_ = uVar141;
  auVar112._0_4_ = uVar141;
  auVar112._8_4_ = uVar141;
  auVar112._12_4_ = uVar141;
  auVar112._16_4_ = uVar141;
  auVar112._20_4_ = uVar141;
  auVar112._24_4_ = uVar141;
  auVar112._28_4_ = uVar141;
  auVar100 = vmaxps_avx512vl(auVar100,auVar112);
  auVar101 = vmaxps_avx(auVar101,auVar100);
  auVar100._8_4_ = 0x3f7ffffa;
  auVar100._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar100._12_4_ = 0x3f7ffffa;
  auVar100._16_4_ = 0x3f7ffffa;
  auVar100._20_4_ = 0x3f7ffffa;
  auVar100._24_4_ = 0x3f7ffffa;
  auVar100._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar101,auVar100);
  auVar174 = ZEXT3264(local_80);
  auVar101 = vpmaxsd_avx2(auVar102,auVar107);
  auVar150 = ZEXT3264(auVar101);
  auVar100 = vpmaxsd_avx2(auVar103,auVar105);
  auVar101 = vminps_avx(auVar101,auVar100);
  auVar100 = vpmaxsd_avx2(auVar104,auVar97);
  fVar152 = ray->tfar;
  auVar113._4_4_ = fVar152;
  auVar113._0_4_ = fVar152;
  auVar113._8_4_ = fVar152;
  auVar113._12_4_ = fVar152;
  auVar113._16_4_ = fVar152;
  auVar113._20_4_ = fVar152;
  auVar113._24_4_ = fVar152;
  auVar113._28_4_ = fVar152;
  auVar100 = vminps_avx512vl(auVar100,auVar113);
  auVar101 = vminps_avx(auVar101,auVar100);
  auVar111._8_4_ = 0x3f800003;
  auVar111._0_8_ = 0x3f8000033f800003;
  auVar111._12_4_ = 0x3f800003;
  auVar111._16_4_ = 0x3f800003;
  auVar111._20_4_ = 0x3f800003;
  auVar111._24_4_ = 0x3f800003;
  auVar111._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar111);
  auVar100 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar100,_DAT_0205a920);
  uVar142 = vcmpps_avx512vl(local_80,auVar101,2);
  local_649 = (byte)((byte)uVar142 & (byte)uVar23) != 0;
  if (local_649) {
    uVar84 = (ulong)(byte)((byte)uVar142 & (byte)uVar23);
    do {
      auVar100 = auVar174._0_32_;
      auVar101 = auVar150._0_32_;
      local_4a0 = in_ZMM21._0_32_;
      local_480 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar78 = uVar84; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_608 = (ulong)*(uint *)(prim + 2);
      local_558 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      pGVar82 = (context->scene->geometries).items[local_608].ptr;
      uVar78 = (ulong)*(uint *)(*(long *)&pGVar82->field_0x58 +
                               pGVar82[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_558);
      p_Var15 = pGVar82[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar82[1].time_range.upper;
      local_630 = *(undefined1 (*) [16])(lVar24 + (long)p_Var15 * uVar78);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar78 + 1) * (long)p_Var15);
      local_510 = *(undefined8 *)*pauVar3;
      uStack_508 = *(undefined8 *)(*pauVar3 + 8);
      auVar91 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar78 + 2) * (long)p_Var15);
      local_540 = *(Geometry **)*pauVar4;
      uStack_518 = *(undefined8 *)(*pauVar4 + 8);
      auVar90 = *pauVar4;
      uVar84 = uVar84 - 1 & uVar84;
      pauVar5 = (undefined1 (*) [16])(lVar24 + (uVar78 + 3) * (long)p_Var15);
      local_4d0 = *(undefined8 *)*pauVar5;
      uStack_4c8 = *(undefined8 *)(*pauVar5 + 8);
      auVar143 = *pauVar5;
      if (uVar84 != 0) {
        uVar81 = uVar84 - 1 & uVar84;
        for (uVar78 = uVar84; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
        if (uVar81 != 0) {
          for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar82[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->org).field_0;
      auVar192 = vsubps_avx(local_630,(undefined1  [16])aVar6);
      uVar141 = auVar192._0_4_;
      auVar92._4_4_ = uVar141;
      auVar92._0_4_ = uVar141;
      auVar92._8_4_ = uVar141;
      auVar92._12_4_ = uVar141;
      auVar9 = vshufps_avx(auVar192,auVar192,0x55);
      auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar152 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar167 = (pre->ray_space).vz.field_0.m128[2];
      fVar168 = (pre->ray_space).vz.field_0.m128[3];
      auVar93._0_4_ = auVar192._0_4_ * fVar152;
      auVar93._4_4_ = auVar192._4_4_ * fVar147;
      auVar93._8_4_ = auVar192._8_4_ * fVar167;
      auVar93._12_4_ = auVar192._12_4_ * fVar168;
      auVar9 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar8,auVar9);
      auVar10 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar92);
      auVar9 = vshufps_avx(local_630,local_630,0xff);
      auVar89 = vsubps_avx(auVar91,(undefined1  [16])aVar6);
      uVar141 = auVar89._0_4_;
      auVar153._4_4_ = uVar141;
      auVar153._0_4_ = uVar141;
      auVar153._8_4_ = uVar141;
      auVar153._12_4_ = uVar141;
      auVar192 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar178._0_4_ = auVar89._0_4_ * fVar152;
      auVar178._4_4_ = auVar89._4_4_ * fVar147;
      auVar178._8_4_ = auVar89._8_4_ * fVar167;
      auVar178._12_4_ = auVar89._12_4_ * fVar168;
      auVar192 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar8,auVar192);
      auVar11 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar153);
      auVar91 = vshufps_avx(auVar91,auVar91,0xff);
      auVar89 = vsubps_avx(auVar90,(undefined1  [16])aVar6);
      uVar141 = auVar89._0_4_;
      auVar175._4_4_ = uVar141;
      auVar175._0_4_ = uVar141;
      auVar175._8_4_ = uVar141;
      auVar175._12_4_ = uVar141;
      auVar192 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar181._0_4_ = auVar89._0_4_ * fVar152;
      auVar181._4_4_ = auVar89._4_4_ * fVar147;
      auVar181._8_4_ = auVar89._8_4_ * fVar167;
      auVar181._12_4_ = auVar89._12_4_ * fVar168;
      auVar192 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar8,auVar192);
      auVar12 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar175);
      auVar90 = vshufps_avx(auVar90,auVar90,0xff);
      auVar89 = vsubps_avx512vl(auVar143,(undefined1  [16])aVar6);
      uVar141 = auVar89._0_4_;
      auVar154._4_4_ = uVar141;
      auVar154._0_4_ = uVar141;
      auVar154._8_4_ = uVar141;
      auVar154._12_4_ = uVar141;
      auVar192 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar182._0_4_ = auVar89._0_4_ * fVar152;
      auVar182._4_4_ = auVar89._4_4_ * fVar147;
      auVar182._8_4_ = auVar89._8_4_ * fVar167;
      auVar182._12_4_ = auVar89._12_4_ * fVar168;
      auVar192 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar8,auVar192);
      auVar192 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar154);
      lVar24 = (long)iVar14 * 0x44;
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar89 = vshufps_avx512vl(auVar143,auVar143,0xff);
      local_420 = vbroadcastss_avx512vl(auVar10);
      auVar159._8_4_ = 1;
      auVar159._0_8_ = 0x100000001;
      auVar159._12_4_ = 1;
      auVar159._16_4_ = 1;
      auVar159._20_4_ = 1;
      auVar159._24_4_ = 1;
      auVar159._28_4_ = 1;
      local_440 = vpermps_avx512vl(auVar159,ZEXT1632(auVar10));
      uVar142 = auVar9._0_8_;
      local_a0._8_8_ = uVar142;
      local_a0._0_8_ = uVar142;
      local_a0._16_8_ = uVar142;
      local_a0._24_8_ = uVar142;
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar141 = auVar11._0_4_;
      local_500._4_4_ = uVar141;
      local_500._0_4_ = uVar141;
      local_500._8_4_ = uVar141;
      local_500._12_4_ = uVar141;
      local_500._16_4_ = uVar141;
      local_500._20_4_ = uVar141;
      local_500._24_4_ = uVar141;
      local_500._28_4_ = uVar141;
      local_c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar11));
      local_e0 = vbroadcastsd_avx512vl(auVar91);
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_100 = vbroadcastss_avx512vl(auVar12);
      local_120 = vpermps_avx512vl(auVar159,ZEXT1632(auVar12));
      local_140 = vbroadcastsd_avx512vl(auVar90);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_160 = vbroadcastss_avx512vl(auVar192);
      local_180 = vpermps_avx512vl(auVar159,ZEXT1632(auVar192));
      uVar142 = auVar89._0_8_;
      register0x000012c8 = uVar142;
      local_1a0 = uVar142;
      register0x000012d0 = uVar142;
      register0x000012d8 = uVar142;
      auVar102 = vmulps_avx512vl(local_160,auVar110);
      auVar103 = vmulps_avx512vl(local_180,auVar110);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar111,local_100);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar111,local_120);
      auVar91 = vfmadd231ps_fma(auVar102,auVar113,local_500);
      auVar104 = vfmadd231ps_avx512vl(auVar103,auVar113,local_c0);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,local_420);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar94 = vfmadd231ps_avx512vl(auVar104,auVar112,local_440);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar95 = vmulps_avx512vl(local_160,auVar98);
      auVar96 = vmulps_avx512vl(local_180,auVar98);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_100);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_120);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_500);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,local_420);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_440);
      auVar97 = vsubps_avx512vl(auVar95,auVar99);
      auVar105 = vsubps_avx512vl(auVar96,auVar94);
      auVar106 = vmulps_avx512vl(auVar94,auVar97);
      auVar107 = vmulps_avx512vl(auVar99,auVar105);
      auVar106 = vsubps_avx512vl(auVar106,auVar107);
      auVar107 = vmulps_avx512vl(_local_1a0,auVar110);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_140);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_a0);
      auVar108 = vmulps_avx512vl(_local_1a0,auVar98);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_140);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_e0);
      auVar9 = vfmadd231ps_fma(auVar108,auVar102,local_a0);
      auVar108 = vmulps_avx512vl(auVar105,auVar105);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,auVar97);
      auVar109 = vmaxps_avx512vl(auVar107,ZEXT1632(auVar9));
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      auVar108 = vmulps_avx512vl(auVar109,auVar108);
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      uVar142 = vcmpps_avx512vl(auVar106,auVar108,2);
      auVar91 = vblendps_avx(auVar10,local_630,8);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar90 = vandps_avx512vl(auVar91,auVar89);
      auVar91 = vblendps_avx(auVar11,*pauVar3,8);
      auVar91 = vandps_avx512vl(auVar91,auVar89);
      auVar90 = vmaxps_avx(auVar90,auVar91);
      auVar91 = vblendps_avx(auVar12,*pauVar4,8);
      auVar92 = vandps_avx512vl(auVar91,auVar89);
      auVar91 = vblendps_avx(auVar192,auVar143,8);
      auVar91 = vandps_avx512vl(auVar91,auVar89);
      auVar91 = vmaxps_avx(auVar92,auVar91);
      auVar91 = vmaxps_avx(auVar90,auVar91);
      auVar90 = vmovshdup_avx(auVar91);
      auVar90 = vmaxss_avx(auVar90,auVar91);
      auVar91 = vshufpd_avx(auVar91,auVar91,1);
      auVar91 = vmaxss_avx(auVar91,auVar90);
      auVar183._0_4_ = (float)iVar14;
      _auStack_3dc = auVar10._4_12_;
      auVar183._4_4_ = auVar183._0_4_;
      auVar183._8_4_ = auVar183._0_4_;
      auVar183._12_4_ = auVar183._0_4_;
      auVar183._16_4_ = auVar183._0_4_;
      auVar183._20_4_ = auVar183._0_4_;
      auVar183._24_4_ = auVar183._0_4_;
      auVar183._28_4_ = auVar183._0_4_;
      uVar23 = vcmpps_avx512vl(auVar183,_DAT_02020f40,0xe);
      local_310 = (byte)uVar142 & (byte)uVar23;
      local_400 = auVar91._0_4_ * 4.7683716e-07;
      auVar160._8_4_ = 2;
      auVar160._0_8_ = 0x200000002;
      auVar160._12_4_ = 2;
      auVar160._16_4_ = 2;
      auVar160._20_4_ = 2;
      auVar160._24_4_ = 2;
      auVar160._28_4_ = 2;
      local_1c0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar10));
      local_1e0 = vpermps_avx512vl(auVar160,ZEXT1632(auVar11));
      local_200 = vpermps_avx512vl(auVar160,ZEXT1632(auVar12));
      local_460 = vpermps_avx2(auVar160,ZEXT1632(auVar192));
      uVar83 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      auVar90 = local_180._0_16_;
      auVar91 = ZEXT416((uint)local_400);
      local_638 = context;
      local_640 = ray;
      local_618 = pre;
      local_520 = local_540;
      local_3e0 = auVar183._0_4_;
      if (local_310 == 0) {
        bVar86 = false;
        auVar91 = vxorps_avx512vl(auVar90,auVar90);
        auVar193 = ZEXT1664(auVar91);
        auVar174 = ZEXT3264(auVar100);
        in_ZMM20 = ZEXT3264(local_480);
        auVar150 = ZEXT3264(auVar101);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar191 = ZEXT3264(local_420);
        auVar190 = ZEXT3264(local_440);
        auVar189 = ZEXT3264(local_500);
      }
      else {
        local_4c0._0_16_ = ZEXT416(uVar83);
        auVar98 = vmulps_avx512vl(local_460,auVar98);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_200,auVar98);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_1e0,auVar104);
        auVar103 = vfmadd213ps_avx512vl(auVar102,local_1c0,auVar103);
        auVar110 = vmulps_avx512vl(local_460,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_200,auVar110);
        auVar104 = vfmadd213ps_avx512vl(auVar113,local_1e0,auVar111);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar104 = vfmadd213ps_avx512vl(auVar112,local_1c0,auVar104);
        auVar112 = vmulps_avx512vl(local_160,auVar102);
        auVar98 = vmulps_avx512vl(local_180,auVar102);
        auVar34._4_4_ = local_460._4_4_ * auVar102._4_4_;
        auVar34._0_4_ = local_460._0_4_ * auVar102._0_4_;
        auVar34._8_4_ = local_460._8_4_ * auVar102._8_4_;
        auVar34._12_4_ = local_460._12_4_ * auVar102._12_4_;
        auVar34._16_4_ = local_460._16_4_ * auVar102._16_4_;
        auVar34._20_4_ = local_460._20_4_ * auVar102._20_4_;
        auVar34._24_4_ = local_460._24_4_ * auVar102._24_4_;
        auVar34._28_4_ = auVar102._28_4_;
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_100);
        auVar102 = vfmadd231ps_avx512vl(auVar98,auVar110,local_120);
        auVar110 = vfmadd231ps_avx512vl(auVar34,local_200,auVar110);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,local_500);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar111,local_c0);
        auVar98 = vfmadd231ps_avx512vl(auVar110,local_1e0,auVar111);
        auVar106 = vfmadd231ps_avx512vl(auVar112,auVar113,local_420);
        auVar190 = ZEXT3264(local_440);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,local_440);
        auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_1c0,auVar113);
        auVar113 = vmulps_avx512vl(local_160,auVar110);
        auVar108 = vmulps_avx512vl(local_180,auVar110);
        auVar35._4_4_ = local_460._4_4_ * auVar110._4_4_;
        auVar35._0_4_ = local_460._0_4_ * auVar110._0_4_;
        auVar35._8_4_ = local_460._8_4_ * auVar110._8_4_;
        auVar35._12_4_ = local_460._12_4_ * auVar110._12_4_;
        auVar35._16_4_ = local_460._16_4_ * auVar110._16_4_;
        auVar35._20_4_ = local_460._20_4_ * auVar110._20_4_;
        auVar35._24_4_ = local_460._24_4_ * auVar110._24_4_;
        auVar35._28_4_ = auVar110._28_4_;
        auVar110 = vfmadd231ps_avx512vl(auVar113,auVar111,local_100);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_120);
        auVar111 = vfmadd231ps_avx512vl(auVar35,local_200,auVar111);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_500);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar111,local_1e0,auVar113);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar112,local_420);
        auVar110 = vfmadd231ps_avx512vl(auVar108,auVar112,local_440);
        auVar108 = vfmadd231ps_avx512vl(auVar113,local_1c0,auVar112);
        auVar187._8_4_ = 0x7fffffff;
        auVar187._0_8_ = 0x7fffffff7fffffff;
        auVar187._12_4_ = 0x7fffffff;
        auVar187._16_4_ = 0x7fffffff;
        auVar187._20_4_ = 0x7fffffff;
        auVar187._24_4_ = 0x7fffffff;
        auVar187._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar106,auVar187);
        auVar113 = vandps_avx(auVar102,auVar187);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar98,auVar187);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        auVar98 = vbroadcastss_avx512vl(auVar91);
        uVar78 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar86 = (bool)((byte)uVar78 & 1);
        auVar114._0_4_ = (float)((uint)bVar86 * auVar97._0_4_ | (uint)!bVar86 * auVar106._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar86 * auVar97._4_4_ | (uint)!bVar86 * auVar106._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar86 * auVar97._8_4_ | (uint)!bVar86 * auVar106._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar86 * auVar97._12_4_ | (uint)!bVar86 * auVar106._12_4_);
        bVar86 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar86 * auVar97._16_4_ | (uint)!bVar86 * auVar106._16_4_);
        bVar86 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar86 * auVar97._20_4_ | (uint)!bVar86 * auVar106._20_4_);
        bVar86 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar86 * auVar97._24_4_ | (uint)!bVar86 * auVar106._24_4_);
        bVar86 = SUB81(uVar78 >> 7,0);
        auVar114._28_4_ = (uint)bVar86 * auVar97._28_4_ | (uint)!bVar86 * auVar106._28_4_;
        bVar86 = (bool)((byte)uVar78 & 1);
        auVar115._0_4_ = (float)((uint)bVar86 * auVar105._0_4_ | (uint)!bVar86 * auVar102._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar86 * auVar105._4_4_ | (uint)!bVar86 * auVar102._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar86 * auVar105._8_4_ | (uint)!bVar86 * auVar102._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar86 * auVar105._12_4_ | (uint)!bVar86 * auVar102._12_4_);
        bVar86 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar86 * auVar105._16_4_ | (uint)!bVar86 * auVar102._16_4_);
        bVar86 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar86 * auVar105._20_4_ | (uint)!bVar86 * auVar102._20_4_);
        bVar86 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar86 * auVar105._24_4_ | (uint)!bVar86 * auVar102._24_4_);
        bVar86 = SUB81(uVar78 >> 7,0);
        auVar115._28_4_ = (uint)bVar86 * auVar105._28_4_ | (uint)!bVar86 * auVar102._28_4_;
        auVar112 = vandps_avx(auVar187,auVar111);
        auVar113 = vandps_avx(auVar110,auVar187);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar108,auVar187);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        uVar78 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar86 = (bool)((byte)uVar78 & 1);
        auVar116._0_4_ = (float)((uint)bVar86 * auVar97._0_4_ | (uint)!bVar86 * auVar111._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar86 * auVar97._4_4_ | (uint)!bVar86 * auVar111._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar86 * auVar97._8_4_ | (uint)!bVar86 * auVar111._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar86 * auVar97._12_4_ | (uint)!bVar86 * auVar111._12_4_);
        bVar86 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar86 * auVar97._16_4_ | (uint)!bVar86 * auVar111._16_4_);
        bVar86 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar86 * auVar97._20_4_ | (uint)!bVar86 * auVar111._20_4_);
        bVar86 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar86 * auVar97._24_4_ | (uint)!bVar86 * auVar111._24_4_);
        bVar86 = SUB81(uVar78 >> 7,0);
        auVar116._28_4_ = (uint)bVar86 * auVar97._28_4_ | (uint)!bVar86 * auVar111._28_4_;
        bVar86 = (bool)((byte)uVar78 & 1);
        auVar117._0_4_ = (float)((uint)bVar86 * auVar105._0_4_ | (uint)!bVar86 * auVar110._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar86 * auVar105._4_4_ | (uint)!bVar86 * auVar110._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar86 * auVar105._8_4_ | (uint)!bVar86 * auVar110._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar86 * auVar105._12_4_ | (uint)!bVar86 * auVar110._12_4_);
        bVar86 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar86 * auVar105._16_4_ | (uint)!bVar86 * auVar110._16_4_);
        bVar86 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar86 * auVar105._20_4_ | (uint)!bVar86 * auVar110._20_4_);
        bVar86 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar86 * auVar105._24_4_ | (uint)!bVar86 * auVar110._24_4_);
        bVar86 = SUB81(uVar78 >> 7,0);
        auVar117._28_4_ = (uint)bVar86 * auVar105._28_4_ | (uint)!bVar86 * auVar110._28_4_;
        auVar93 = vxorps_avx512vl(auVar90,auVar90);
        auVar193 = ZEXT1664(auVar93);
        auVar112 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar93));
        auVar90 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar152 = auVar112._0_4_;
        fVar147 = auVar112._4_4_;
        fVar167 = auVar112._8_4_;
        fVar168 = auVar112._12_4_;
        fVar169 = auVar112._16_4_;
        fVar162 = auVar112._20_4_;
        fVar87 = auVar112._24_4_;
        auVar36._4_4_ = fVar147 * fVar147 * fVar147 * auVar90._4_4_ * -0.5;
        auVar36._0_4_ = fVar152 * fVar152 * fVar152 * auVar90._0_4_ * -0.5;
        auVar36._8_4_ = fVar167 * fVar167 * fVar167 * auVar90._8_4_ * -0.5;
        auVar36._12_4_ = fVar168 * fVar168 * fVar168 * auVar90._12_4_ * -0.5;
        auVar36._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar36._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar36._24_4_ = fVar87 * fVar87 * fVar87 * -0.0;
        auVar36._28_4_ = 0;
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar36,auVar113,auVar112);
        auVar37._4_4_ = auVar115._4_4_ * auVar111._4_4_;
        auVar37._0_4_ = auVar115._0_4_ * auVar111._0_4_;
        auVar37._8_4_ = auVar115._8_4_ * auVar111._8_4_;
        auVar37._12_4_ = auVar115._12_4_ * auVar111._12_4_;
        auVar37._16_4_ = auVar115._16_4_ * auVar111._16_4_;
        auVar37._20_4_ = auVar115._20_4_ * auVar111._20_4_;
        auVar37._24_4_ = auVar115._24_4_ * auVar111._24_4_;
        auVar37._28_4_ = auVar112._28_4_;
        auVar38._4_4_ = auVar111._4_4_ * -auVar114._4_4_;
        auVar38._0_4_ = auVar111._0_4_ * -auVar114._0_4_;
        auVar38._8_4_ = auVar111._8_4_ * -auVar114._8_4_;
        auVar38._12_4_ = auVar111._12_4_ * -auVar114._12_4_;
        auVar38._16_4_ = auVar111._16_4_ * -auVar114._16_4_;
        auVar38._20_4_ = auVar111._20_4_ * -auVar114._20_4_;
        auVar38._24_4_ = auVar111._24_4_ * -auVar114._24_4_;
        auVar38._28_4_ = auVar114._28_4_ ^ 0x80000000;
        auVar112 = vmulps_avx512vl(auVar111,ZEXT1632(auVar93));
        auVar97 = ZEXT1632(auVar93);
        auVar110 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar97);
        auVar90 = vfmadd231ps_fma(auVar110,auVar117,auVar117);
        auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar152 = auVar110._0_4_;
        fVar147 = auVar110._4_4_;
        fVar167 = auVar110._8_4_;
        fVar168 = auVar110._12_4_;
        fVar169 = auVar110._16_4_;
        fVar162 = auVar110._20_4_;
        fVar87 = auVar110._24_4_;
        auVar39._4_4_ = fVar147 * fVar147 * fVar147 * auVar90._4_4_ * -0.5;
        auVar39._0_4_ = fVar152 * fVar152 * fVar152 * auVar90._0_4_ * -0.5;
        auVar39._8_4_ = fVar167 * fVar167 * fVar167 * auVar90._8_4_ * -0.5;
        auVar39._12_4_ = fVar168 * fVar168 * fVar168 * auVar90._12_4_ * -0.5;
        auVar39._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar39._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar39._24_4_ = fVar87 * fVar87 * fVar87 * -0.0;
        auVar39._28_4_ = 0;
        auVar113 = vfmadd231ps_avx512vl(auVar39,auVar113,auVar110);
        auVar40._4_4_ = auVar117._4_4_ * auVar113._4_4_;
        auVar40._0_4_ = auVar117._0_4_ * auVar113._0_4_;
        auVar40._8_4_ = auVar117._8_4_ * auVar113._8_4_;
        auVar40._12_4_ = auVar117._12_4_ * auVar113._12_4_;
        auVar40._16_4_ = auVar117._16_4_ * auVar113._16_4_;
        auVar40._20_4_ = auVar117._20_4_ * auVar113._20_4_;
        auVar40._24_4_ = auVar117._24_4_ * auVar113._24_4_;
        auVar40._28_4_ = auVar110._28_4_;
        auVar41._4_4_ = -auVar116._4_4_ * auVar113._4_4_;
        auVar41._0_4_ = -auVar116._0_4_ * auVar113._0_4_;
        auVar41._8_4_ = -auVar116._8_4_ * auVar113._8_4_;
        auVar41._12_4_ = -auVar116._12_4_ * auVar113._12_4_;
        auVar41._16_4_ = -auVar116._16_4_ * auVar113._16_4_;
        auVar41._20_4_ = -auVar116._20_4_ * auVar113._20_4_;
        auVar41._24_4_ = -auVar116._24_4_ * auVar113._24_4_;
        auVar41._28_4_ = auVar111._28_4_;
        auVar113 = vmulps_avx512vl(auVar113,auVar97);
        auVar90 = vfmadd213ps_fma(auVar37,auVar107,auVar99);
        auVar143 = vfmadd213ps_fma(auVar38,auVar107,auVar94);
        auVar111 = vfmadd213ps_avx512vl(auVar112,auVar107,auVar104);
        auVar110 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar9),auVar95);
        auVar12 = vfnmadd213ps_fma(auVar37,auVar107,auVar99);
        auVar98 = ZEXT1632(auVar9);
        auVar192 = vfmadd213ps_fma(auVar41,auVar98,auVar96);
        auVar92 = vfnmadd213ps_fma(auVar38,auVar107,auVar94);
        auVar89 = vfmadd213ps_fma(auVar113,auVar98,auVar103);
        auVar102 = vfnmadd231ps_avx512vl(auVar104,auVar107,auVar112);
        auVar153 = vfnmadd213ps_fma(auVar40,auVar98,auVar95);
        auVar154 = vfnmadd213ps_fma(auVar41,auVar98,auVar96);
        auVar175 = vfnmadd231ps_fma(auVar103,ZEXT1632(auVar9),auVar113);
        auVar113 = vsubps_avx512vl(auVar110,ZEXT1632(auVar12));
        auVar112 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar92));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar89),auVar102);
        auVar104 = vmulps_avx512vl(auVar112,auVar102);
        auVar10 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar92),auVar103);
        auVar42._4_4_ = auVar12._4_4_ * auVar103._4_4_;
        auVar42._0_4_ = auVar12._0_4_ * auVar103._0_4_;
        auVar42._8_4_ = auVar12._8_4_ * auVar103._8_4_;
        auVar42._12_4_ = auVar12._12_4_ * auVar103._12_4_;
        auVar42._16_4_ = auVar103._16_4_ * 0.0;
        auVar42._20_4_ = auVar103._20_4_ * 0.0;
        auVar42._24_4_ = auVar103._24_4_ * 0.0;
        auVar42._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar42,auVar102,auVar113);
        auVar43._4_4_ = auVar92._4_4_ * auVar113._4_4_;
        auVar43._0_4_ = auVar92._0_4_ * auVar113._0_4_;
        auVar43._8_4_ = auVar92._8_4_ * auVar113._8_4_;
        auVar43._12_4_ = auVar92._12_4_ * auVar113._12_4_;
        auVar43._16_4_ = auVar113._16_4_ * 0.0;
        auVar43._20_4_ = auVar113._20_4_ * 0.0;
        auVar43._24_4_ = auVar113._24_4_ * 0.0;
        auVar43._28_4_ = auVar113._28_4_;
        auVar11 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar12),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar97,auVar103);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar97,ZEXT1632(auVar10));
        auVar96 = ZEXT1632(auVar93);
        uVar78 = vcmpps_avx512vl(auVar112,auVar96,2);
        bVar79 = (byte)uVar78;
        fVar87 = (float)((uint)(bVar79 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar153._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar151 = (float)((uint)bVar86 * auVar90._4_4_ | (uint)!bVar86 * auVar153._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar134 = (float)((uint)bVar86 * auVar90._8_4_ | (uint)!bVar86 * auVar153._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar137 = (float)((uint)bVar86 * auVar90._12_4_ | (uint)!bVar86 * auVar153._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar151,fVar87))));
        fVar88 = (float)((uint)(bVar79 & 1) * auVar143._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar154._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar133 = (float)((uint)bVar86 * auVar143._4_4_ | (uint)!bVar86 * auVar154._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar135 = (float)((uint)bVar86 * auVar143._8_4_ | (uint)!bVar86 * auVar154._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar138 = (float)((uint)bVar86 * auVar143._12_4_ | (uint)!bVar86 * auVar154._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar88))));
        auVar118._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar111._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar175._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar86 * auVar111._4_4_ | (uint)!bVar86 * auVar175._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar86 * auVar111._8_4_ | (uint)!bVar86 * auVar175._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar86 * auVar111._12_4_ | (uint)!bVar86 * auVar175._12_4_);
        fVar152 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar111._16_4_);
        auVar118._16_4_ = fVar152;
        fVar147 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar111._20_4_);
        auVar118._20_4_ = fVar147;
        fVar167 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar111._24_4_);
        auVar118._24_4_ = fVar167;
        iVar1 = (uint)(byte)(uVar78 >> 7) * auVar111._28_4_;
        auVar118._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar110);
        auVar119._0_4_ =
             (uint)(bVar79 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar10._0_4_;
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar86 * auVar113._4_4_ | (uint)!bVar86 * auVar10._4_4_;
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar86 * auVar113._8_4_ | (uint)!bVar86 * auVar10._8_4_;
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar86 * auVar113._12_4_ | (uint)!bVar86 * auVar10._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_;
        auVar119._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar192));
        auVar120._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar143._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar86 * auVar113._4_4_ | (uint)!bVar86 * auVar143._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar86 * auVar113._8_4_ | (uint)!bVar86 * auVar143._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar86 * auVar113._12_4_ | (uint)!bVar86 * auVar143._12_4_);
        fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_);
        auVar120._16_4_ = fVar169;
        fVar162 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_);
        auVar120._20_4_ = fVar162;
        fVar168 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_);
        auVar120._24_4_ = fVar168;
        auVar120._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar89));
        auVar121._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar111._0_4_);
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar86 * auVar113._4_4_ | (uint)!bVar86 * auVar111._4_4_);
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar86 * auVar113._8_4_ | (uint)!bVar86 * auVar111._8_4_);
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar86 * auVar113._12_4_ | (uint)!bVar86 * auVar111._12_4_);
        bVar86 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar86 * auVar113._16_4_ | (uint)!bVar86 * auVar111._16_4_);
        bVar86 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar86 * auVar113._20_4_ | (uint)!bVar86 * auVar111._20_4_);
        bVar86 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar86 * auVar113._24_4_ | (uint)!bVar86 * auVar111._24_4_);
        bVar86 = SUB81(uVar78 >> 7,0);
        auVar121._28_4_ = (uint)bVar86 * auVar113._28_4_ | (uint)!bVar86 * auVar111._28_4_;
        auVar122._0_4_ =
             (uint)(bVar79 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar110._0_4_;
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar86 * (int)auVar12._4_4_ | (uint)!bVar86 * auVar110._4_4_;
        bVar86 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar86 * (int)auVar12._8_4_ | (uint)!bVar86 * auVar110._8_4_;
        bVar86 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar86 * (int)auVar12._12_4_ | (uint)!bVar86 * auVar110._12_4_;
        auVar122._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_;
        auVar122._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_;
        auVar122._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_;
        auVar122._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar110._28_4_;
        bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar123._0_4_ =
             (uint)(bVar79 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar89._0_4_;
        bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar89._4_4_;
        bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar89._8_4_;
        bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar89._12_4_;
        auVar123._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_;
        auVar123._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_;
        auVar123._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar78 >> 7) * auVar102._28_4_;
        auVar123._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar122,auVar104);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar92._12_4_ |
                                                 (uint)!bVar18 * auVar192._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar92._8_4_ |
                                                          (uint)!bVar17 * auVar192._8_4_,
                                                          CONCAT44((uint)bVar86 * (int)auVar92._4_4_
                                                                   | (uint)!bVar86 * auVar192._4_4_,
                                                                   (uint)(bVar79 & 1) *
                                                                   (int)auVar92._0_4_ |
                                                                   (uint)!(bool)(bVar79 & 1) *
                                                                   auVar192._0_4_)))),auVar98);
        auVar111 = vsubps_avx(auVar123,auVar118);
        auVar110 = vsubps_avx(auVar104,auVar119);
        auVar102 = vsubps_avx(auVar98,auVar120);
        auVar103 = vsubps_avx(auVar118,auVar121);
        auVar44._4_4_ = auVar111._4_4_ * fVar151;
        auVar44._0_4_ = auVar111._0_4_ * fVar87;
        auVar44._8_4_ = auVar111._8_4_ * fVar134;
        auVar44._12_4_ = auVar111._12_4_ * fVar137;
        auVar44._16_4_ = auVar111._16_4_ * 0.0;
        auVar44._20_4_ = auVar111._20_4_ * 0.0;
        auVar44._24_4_ = auVar111._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar44,auVar118,auVar99);
        auVar45._4_4_ = fVar133 * auVar99._4_4_;
        auVar45._0_4_ = fVar88 * auVar99._0_4_;
        auVar45._8_4_ = fVar135 * auVar99._8_4_;
        auVar45._12_4_ = fVar138 * auVar99._12_4_;
        auVar45._16_4_ = auVar99._16_4_ * 0.0;
        auVar45._20_4_ = auVar99._20_4_ * 0.0;
        auVar45._24_4_ = auVar99._24_4_ * 0.0;
        auVar45._28_4_ = auVar112._28_4_;
        auVar143 = vfmsub231ps_fma(auVar45,auVar104,auVar113);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar143),auVar96,ZEXT1632(auVar90));
        auVar163._0_4_ = auVar113._0_4_ * auVar118._0_4_;
        auVar163._4_4_ = auVar113._4_4_ * auVar118._4_4_;
        auVar163._8_4_ = auVar113._8_4_ * auVar118._8_4_;
        auVar163._12_4_ = auVar113._12_4_ * auVar118._12_4_;
        auVar163._16_4_ = auVar113._16_4_ * fVar152;
        auVar163._20_4_ = auVar113._20_4_ * fVar147;
        auVar163._24_4_ = auVar113._24_4_ * fVar167;
        auVar163._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar163,auVar98,auVar111);
        auVar94 = vfmadd231ps_avx512vl(auVar112,auVar96,ZEXT1632(auVar90));
        auVar112 = vmulps_avx512vl(auVar103,auVar119);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar110,auVar121);
        auVar46._4_4_ = auVar102._4_4_ * auVar121._4_4_;
        auVar46._0_4_ = auVar102._0_4_ * auVar121._0_4_;
        auVar46._8_4_ = auVar102._8_4_ * auVar121._8_4_;
        auVar46._12_4_ = auVar102._12_4_ * auVar121._12_4_;
        auVar46._16_4_ = auVar102._16_4_ * auVar121._16_4_;
        auVar46._20_4_ = auVar102._20_4_ * auVar121._20_4_;
        auVar46._24_4_ = auVar102._24_4_ * auVar121._24_4_;
        auVar46._28_4_ = auVar121._28_4_;
        auVar90 = vfmsub231ps_fma(auVar46,auVar120,auVar103);
        auVar164._0_4_ = auVar120._0_4_ * auVar110._0_4_;
        auVar164._4_4_ = auVar120._4_4_ * auVar110._4_4_;
        auVar164._8_4_ = auVar120._8_4_ * auVar110._8_4_;
        auVar164._12_4_ = auVar120._12_4_ * auVar110._12_4_;
        auVar164._16_4_ = fVar169 * auVar110._16_4_;
        auVar164._20_4_ = fVar162 * auVar110._20_4_;
        auVar164._24_4_ = fVar168 * auVar110._24_4_;
        auVar164._28_4_ = 0;
        auVar143 = vfmsub231ps_fma(auVar164,auVar102,auVar119);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar143),auVar96,auVar112);
        auVar95 = vfmadd231ps_avx512vl(auVar112,auVar96,ZEXT1632(auVar90));
        auVar112 = vmaxps_avx(auVar94,auVar95);
        uVar142 = vcmpps_avx512vl(auVar112,auVar96,2);
        local_310 = local_310 & (byte)uVar142;
        in_ZMM20 = ZEXT3264(local_480);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar191 = ZEXT3264(local_420);
        auVar189 = ZEXT3264(local_500);
        auVar186 = ZEXT1664(auVar91);
        if (local_310 == 0) {
          local_310 = 0;
          auVar174 = ZEXT3264(auVar100);
          auVar150 = ZEXT3264(auVar101);
        }
        else {
          auVar47._4_4_ = auVar103._4_4_ * auVar113._4_4_;
          auVar47._0_4_ = auVar103._0_4_ * auVar113._0_4_;
          auVar47._8_4_ = auVar103._8_4_ * auVar113._8_4_;
          auVar47._12_4_ = auVar103._12_4_ * auVar113._12_4_;
          auVar47._16_4_ = auVar103._16_4_ * auVar113._16_4_;
          auVar47._20_4_ = auVar103._20_4_ * auVar113._20_4_;
          auVar47._24_4_ = auVar103._24_4_ * auVar113._24_4_;
          auVar47._28_4_ = auVar112._28_4_;
          auVar192 = vfmsub231ps_fma(auVar47,auVar102,auVar111);
          auVar48._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar48._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar48._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar48._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar48._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar48._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar48._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar48._28_4_ = auVar111._28_4_;
          auVar143 = vfmsub231ps_fma(auVar48,auVar99,auVar103);
          auVar49._4_4_ = auVar102._4_4_ * auVar99._4_4_;
          auVar49._0_4_ = auVar102._0_4_ * auVar99._0_4_;
          auVar49._8_4_ = auVar102._8_4_ * auVar99._8_4_;
          auVar49._12_4_ = auVar102._12_4_ * auVar99._12_4_;
          auVar49._16_4_ = auVar102._16_4_ * auVar99._16_4_;
          auVar49._20_4_ = auVar102._20_4_ * auVar99._20_4_;
          auVar49._24_4_ = auVar102._24_4_ * auVar99._24_4_;
          auVar49._28_4_ = auVar102._28_4_;
          auVar89 = vfmsub231ps_fma(auVar49,auVar110,auVar113);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar143),ZEXT1632(auVar89));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar192),auVar96);
          auVar113 = vrcp14ps_avx512vl(auVar112);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar25);
          auVar90 = vfmadd132ps_fma(auVar111,auVar113,auVar113);
          auVar50._4_4_ = auVar89._4_4_ * auVar118._4_4_;
          auVar50._0_4_ = auVar89._0_4_ * auVar118._0_4_;
          auVar50._8_4_ = auVar89._8_4_ * auVar118._8_4_;
          auVar50._12_4_ = auVar89._12_4_ * auVar118._12_4_;
          auVar50._16_4_ = fVar152 * 0.0;
          auVar50._20_4_ = fVar147 * 0.0;
          auVar50._24_4_ = fVar167 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar143 = vfmadd231ps_fma(auVar50,auVar98,ZEXT1632(auVar143));
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar104,ZEXT1632(auVar192));
          fVar147 = auVar90._0_4_;
          fVar167 = auVar90._4_4_;
          fVar168 = auVar90._8_4_;
          fVar169 = auVar90._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar143._12_4_ * fVar169,
                                        CONCAT48(auVar143._8_4_ * fVar168,
                                                 CONCAT44(auVar143._4_4_ * fVar167,
                                                          auVar143._0_4_ * fVar147))));
          auVar150 = ZEXT3264(auVar113);
          auVar176._4_4_ = uVar83;
          auVar176._0_4_ = uVar83;
          auVar176._8_4_ = uVar83;
          auVar176._12_4_ = uVar83;
          auVar176._16_4_ = uVar83;
          auVar176._20_4_ = uVar83;
          auVar176._24_4_ = uVar83;
          auVar176._28_4_ = uVar83;
          uVar142 = vcmpps_avx512vl(auVar176,auVar113,2);
          fVar152 = ray->tfar;
          auVar26._4_4_ = fVar152;
          auVar26._0_4_ = fVar152;
          auVar26._8_4_ = fVar152;
          auVar26._12_4_ = fVar152;
          auVar26._16_4_ = fVar152;
          auVar26._20_4_ = fVar152;
          auVar26._24_4_ = fVar152;
          auVar26._28_4_ = fVar152;
          uVar23 = vcmpps_avx512vl(auVar113,auVar26,2);
          local_310 = (byte)uVar142 & (byte)uVar23 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar174 = ZEXT3264(auVar100);
            auVar150 = ZEXT3264(auVar101);
          }
          else {
            uVar142 = vcmpps_avx512vl(auVar112,auVar96,4);
            if ((local_310 & (byte)uVar142) == 0) {
              local_310 = 0;
              auVar174 = ZEXT3264(auVar100);
              auVar150 = ZEXT3264(auVar101);
            }
            else {
              local_310 = local_310 & (byte)uVar142;
              fVar152 = auVar94._0_4_ * fVar147;
              fVar162 = auVar94._4_4_ * fVar167;
              auVar51._4_4_ = fVar162;
              auVar51._0_4_ = fVar152;
              fVar87 = auVar94._8_4_ * fVar168;
              auVar51._8_4_ = fVar87;
              fVar88 = auVar94._12_4_ * fVar169;
              auVar51._12_4_ = fVar88;
              fVar151 = auVar94._16_4_ * 0.0;
              auVar51._16_4_ = fVar151;
              fVar133 = auVar94._20_4_ * 0.0;
              auVar51._20_4_ = fVar133;
              fVar134 = auVar94._24_4_ * 0.0;
              auVar51._24_4_ = fVar134;
              auVar51._28_4_ = auVar94._28_4_;
              fVar147 = auVar95._0_4_ * fVar147;
              fVar167 = auVar95._4_4_ * fVar167;
              auVar52._4_4_ = fVar167;
              auVar52._0_4_ = fVar147;
              fVar168 = auVar95._8_4_ * fVar168;
              auVar52._8_4_ = fVar168;
              fVar169 = auVar95._12_4_ * fVar169;
              auVar52._12_4_ = fVar169;
              fVar135 = auVar95._16_4_ * 0.0;
              auVar52._16_4_ = fVar135;
              fVar137 = auVar95._20_4_ * 0.0;
              auVar52._20_4_ = fVar137;
              fVar138 = auVar95._24_4_ * 0.0;
              auVar52._24_4_ = fVar138;
              auVar52._28_4_ = auVar95._28_4_;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = &DAT_3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar101 = vsubps_avx(auVar172,auVar51);
              bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
              bVar21 = SUB81(uVar78 >> 7,0);
              auVar174 = ZEXT3264(CONCAT428((uint)bVar21 * auVar94._28_4_ |
                                            (uint)!bVar21 * auVar101._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar134 |
                                                      (uint)!bVar20 * auVar101._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar133 |
                                                                (uint)!bVar19 * auVar101._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar151 |
                                                                          (uint)!bVar18 *
                                                                          auVar101._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar88 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar101._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar87 |
                                                  (uint)!bVar16 * auVar101._8_4_,
                                                  CONCAT44((uint)bVar86 * (int)fVar162 |
                                                           (uint)!bVar86 * auVar101._4_4_,
                                                           (uint)(bVar79 & 1) * (int)fVar152 |
                                                           (uint)!(bool)(bVar79 & 1) *
                                                           auVar101._0_4_))))))));
              auVar101 = vsubps_avx(auVar172,auVar52);
              bVar86 = (bool)((byte)(uVar78 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar78 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
              bVar21 = SUB81(uVar78 >> 7,0);
              local_260._4_4_ = (uint)bVar86 * (int)fVar167 | (uint)!bVar86 * auVar101._4_4_;
              local_260._0_4_ =
                   (uint)(bVar79 & 1) * (int)fVar147 | (uint)!(bool)(bVar79 & 1) * auVar101._0_4_;
              local_260._8_4_ = (uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar101._8_4_;
              local_260._12_4_ = (uint)bVar17 * (int)fVar169 | (uint)!bVar17 * auVar101._12_4_;
              local_260._16_4_ = (uint)bVar18 * (int)fVar135 | (uint)!bVar18 * auVar101._16_4_;
              local_260._20_4_ = (uint)bVar19 * (int)fVar137 | (uint)!bVar19 * auVar101._20_4_;
              local_260._24_4_ = (uint)bVar20 * (int)fVar138 | (uint)!bVar20 * auVar101._24_4_;
              local_260._28_4_ = (uint)bVar21 * auVar95._28_4_ | (uint)!bVar21 * auVar101._28_4_;
            }
          }
        }
        auVar180 = ZEXT1664(local_630);
        if (local_310 != 0) {
          auVar101 = vsubps_avx(ZEXT1632(auVar9),auVar107);
          local_5e0 = auVar174._0_32_;
          auVar90 = vfmadd213ps_fma(auVar101,local_5e0,auVar107);
          fVar152 = pre->depth_scale;
          auVar27._4_4_ = fVar152;
          auVar27._0_4_ = fVar152;
          auVar27._8_4_ = fVar152;
          auVar27._12_4_ = fVar152;
          auVar27._16_4_ = fVar152;
          auVar27._20_4_ = fVar152;
          auVar27._24_4_ = fVar152;
          auVar27._28_4_ = fVar152;
          auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                        CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                 CONCAT44(auVar90._4_4_ +
                                                                          auVar90._4_4_,
                                                                          auVar90._0_4_ +
                                                                          auVar90._0_4_)))),auVar27)
          ;
          local_600 = auVar150._0_32_;
          uVar142 = vcmpps_avx512vl(local_600,auVar101,6);
          local_310 = local_310 & (byte)uVar142;
          if (local_310 != 0) {
            auVar144._8_4_ = 0xbf800000;
            auVar144._0_8_ = 0xbf800000bf800000;
            auVar144._12_4_ = 0xbf800000;
            auVar144._16_4_ = 0xbf800000;
            auVar144._20_4_ = 0xbf800000;
            auVar144._24_4_ = 0xbf800000;
            auVar144._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_260,auVar144,auVar28);
            local_260 = local_3a0;
            auVar101 = local_260;
            local_360 = 0;
            if ((pGVar82->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar86 = true, pGVar82->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar152 = 1.0 / auVar183._0_4_;
                local_300[0] = fVar152 * (auVar174._0_4_ + 0.0);
                local_300[1] = fVar152 * (auVar174._4_4_ + 1.0);
                local_300[2] = fVar152 * (auVar174._8_4_ + 2.0);
                local_300[3] = fVar152 * (auVar174._12_4_ + 3.0);
                fStack_2f0 = fVar152 * (auVar174._16_4_ + 4.0);
                fStack_2ec = fVar152 * (auVar174._20_4_ + 5.0);
                fStack_2e8 = fVar152 * (auVar174._24_4_ + 6.0);
                fStack_2e4 = auVar174._28_4_ + 7.0;
                local_260._0_8_ = local_3a0._0_8_;
                local_260._8_8_ = local_3a0._8_8_;
                local_260._16_8_ = local_3a0._16_8_;
                local_260._24_8_ = local_3a0._24_8_;
                local_2e0 = local_260._0_8_;
                uStack_2d8 = local_260._8_8_;
                uStack_2d0 = local_260._16_8_;
                uStack_2c8 = local_260._24_8_;
                local_2c0 = local_600;
                local_4e0 = (float)local_510;
                uStack_4dc = (undefined4)((ulong)local_510 >> 0x20);
                lVar85 = 0;
                uVar81 = (ulong)local_310;
                for (uVar78 = uVar81; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000)
                {
                  lVar85 = lVar85 + 1;
                }
                bVar86 = true;
                local_550 = local_4d0;
                uStack_548 = uStack_4c8;
                uStack_538 = uStack_518;
                local_530 = auVar91;
                uStack_4d8 = uStack_508;
                local_3c0 = local_5e0;
                local_380 = local_600;
                local_35c = iVar14;
                local_350 = local_630;
                local_340 = local_510;
                uStack_338 = uStack_508;
                local_330 = local_540;
                uStack_328 = uStack_518;
                local_320 = local_4d0;
                uStack_318 = uStack_4c8;
                local_260 = auVar101;
                do {
                  auVar192 = auVar193._0_16_;
                  local_584 = local_300[lVar85];
                  local_580 = *(undefined4 *)((long)&local_2e0 + lVar85 * 4);
                  local_610 = CONCAT44(local_610._4_4_,ray->tfar);
                  local_2a0 = (uint)lVar85;
                  uStack_29c = (uint)((ulong)lVar85 >> 0x20);
                  ray->tfar = *(float *)(local_2c0 + lVar85 * 4);
                  local_5c0.context = context->user;
                  fVar152 = 1.0 - local_584;
                  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(local_584 * (fVar152 + fVar152))),
                                            ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
                  auVar143 = ZEXT416((uint)local_584);
                  auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                            ZEXT416(0xc0a00000));
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584 * 3.0)),
                                            ZEXT416((uint)(local_584 + local_584)),auVar91);
                  auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                            ZEXT416(0x40000000));
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * -3.0)),
                                            ZEXT416((uint)(fVar152 + fVar152)),auVar91);
                  auVar143 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584)),auVar143,
                                             ZEXT416((uint)(fVar152 * -2.0)));
                  fVar152 = auVar9._0_4_ * 0.5;
                  fVar147 = auVar90._0_4_ * 0.5;
                  fVar167 = auVar91._0_4_ * 0.5;
                  fVar168 = auVar143._0_4_ * 0.5;
                  auVar155._0_4_ = fVar168 * (float)local_550;
                  auVar155._4_4_ = fVar168 * local_550._4_4_;
                  auVar155._8_4_ = fVar168 * (float)uStack_548;
                  auVar155._12_4_ = fVar168 * uStack_548._4_4_;
                  auVar170._4_4_ = fVar167;
                  auVar170._0_4_ = fVar167;
                  auVar170._8_4_ = fVar167;
                  auVar170._12_4_ = fVar167;
                  auVar72._8_8_ = uStack_538;
                  auVar72._0_8_ = local_540;
                  auVar91 = vfmadd132ps_fma(auVar170,auVar155,auVar72);
                  auVar156._4_4_ = fVar147;
                  auVar156._0_4_ = fVar147;
                  auVar156._8_4_ = fVar147;
                  auVar156._12_4_ = fVar147;
                  auVar73._4_4_ = uStack_4dc;
                  auVar73._0_4_ = local_4e0;
                  auVar73._8_8_ = uStack_4d8;
                  auVar91 = vfmadd132ps_fma(auVar156,auVar91,auVar73);
                  auVar148._4_4_ = fVar152;
                  auVar148._0_4_ = fVar152;
                  auVar148._8_4_ = fVar152;
                  auVar148._12_4_ = fVar152;
                  auVar91 = vfmadd213ps_fma(auVar148,auVar180._0_16_,auVar91);
                  local_590 = vmovlps_avx(auVar91);
                  local_588 = vextractps_avx(auVar91,2);
                  local_57c = (undefined4)local_558;
                  local_578 = (undefined4)local_608;
                  local_574 = (local_5c0.context)->instID[0];
                  local_570 = (local_5c0.context)->instPrimID[0];
                  local_644 = -1;
                  local_5c0.valid = &local_644;
                  local_5c0.geometryUserPtr = pGVar82->userPtr;
                  local_5c0.hit = (RTCHitN *)&local_590;
                  local_5c0.N = 1;
                  local_400 = (float)uVar81;
                  fStack_3fc = (float)(uVar81 >> 0x20);
                  local_5c0.ray = (RTCRayN *)ray;
                  if (pGVar82->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01dbe29d:
                    auVar91 = auVar193._0_16_;
                    p_Var15 = context->args->filter;
                    fVar152 = auVar186._0_4_;
                    if (p_Var15 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar82->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var15)(&local_5c0);
                      auVar186 = ZEXT1664(local_530);
                      auVar189 = ZEXT3264(local_500);
                      auVar190 = ZEXT3264(local_440);
                      auVar191 = ZEXT3264(local_420);
                      auVar180 = ZEXT1664(local_630);
                      in_ZMM21 = ZEXT3264(local_4a0);
                      in_ZMM20 = ZEXT3264(local_480);
                      auVar91 = vxorps_avx512vl(auVar91,auVar91);
                      auVar193 = ZEXT1664(auVar91);
                      context = local_638;
                      ray = local_640;
                      pre = local_618;
                      uVar83 = local_4c0._0_4_;
                    }
                    uVar81 = CONCAT44(fStack_3fc,local_400);
                    fVar152 = auVar186._0_4_;
                    if (*local_5c0.valid != 0) break;
                  }
                  else {
                    (*pGVar82->occlusionFilterN)(&local_5c0);
                    uVar81 = CONCAT44(fStack_3fc,local_400);
                    auVar186 = ZEXT1664(local_530);
                    auVar189 = ZEXT3264(local_500);
                    auVar190 = ZEXT3264(local_440);
                    auVar191 = ZEXT3264(local_420);
                    auVar180 = ZEXT1664(local_630);
                    in_ZMM21 = ZEXT3264(local_4a0);
                    in_ZMM20 = ZEXT3264(local_480);
                    auVar91 = vxorps_avx512vl(auVar192,auVar192);
                    auVar193 = ZEXT1664(auVar91);
                    context = local_638;
                    ray = local_640;
                    pre = local_618;
                    uVar83 = local_4c0._0_4_;
                    if (*local_5c0.valid != 0) goto LAB_01dbe29d;
                  }
                  ray->tfar = (float)local_610;
                  lVar85 = 0;
                  uVar81 = uVar81 ^ 1L << ((ulong)local_2a0 & 0x3f);
                  for (uVar78 = uVar81; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000
                      ) {
                    lVar85 = lVar85 + 1;
                  }
                  bVar86 = uVar81 != 0;
                  fVar152 = auVar186._0_4_;
                } while (bVar86);
                local_400 = fVar152;
                auVar174 = ZEXT3264(local_5e0);
                auVar150 = ZEXT3264(local_600);
                local_638 = context;
                local_640 = ray;
                local_618 = pre;
              }
              goto LAB_01dbe3d5;
            }
          }
        }
        bVar86 = false;
      }
LAB_01dbe3d5:
      if (8 < iVar14) {
        local_4c0 = vpbroadcastd_avx512vl();
        local_2a0 = uVar83;
        uStack_29c = uVar83;
        uStack_298 = uVar83;
        uStack_294 = uVar83;
        uStack_290 = uVar83;
        uStack_28c = uVar83;
        uStack_288 = uVar83;
        uStack_284 = uVar83;
        fStack_3d0 = 1.0 / local_3e0;
        auStack_3dc._0_4_ = fStack_3d0;
        local_3e0 = fStack_3d0;
        auStack_3dc._4_4_ = fStack_3d0;
        fStack_3d4 = fStack_3d0;
        lVar85 = 8;
        local_5e0 = auVar174._0_32_;
        local_600 = auVar150._0_32_;
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_3cc = fStack_3d0;
        fStack_3c8 = fStack_3d0;
        fStack_3c4 = fStack_3d0;
        do {
          auVar101 = vpbroadcastd_avx512vl();
          auVar111 = vpor_avx2(auVar101,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar111,local_4c0,1);
          auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar85 * 4 + lVar24);
          auVar100 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar85 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar85 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar85 * 4);
          auVar110 = vmulps_avx512vl(local_160,auVar113);
          auVar102 = vmulps_avx512vl(local_180,auVar113);
          auVar53._4_4_ = auVar113._4_4_ * (float)local_1a0._4_4_;
          auVar53._0_4_ = auVar113._0_4_ * (float)local_1a0._0_4_;
          auVar53._8_4_ = auVar113._8_4_ * fStack_198;
          auVar53._12_4_ = auVar113._12_4_ * fStack_194;
          auVar53._16_4_ = auVar113._16_4_ * fStack_190;
          auVar53._20_4_ = auVar113._20_4_ * fStack_18c;
          auVar53._24_4_ = auVar113._24_4_ * fStack_188;
          auVar53._28_4_ = auVar111._28_4_;
          auVar111 = vfmadd231ps_avx512vl(auVar110,auVar112,local_100);
          auVar110 = vfmadd231ps_avx512vl(auVar102,auVar112,local_120);
          auVar102 = vfmadd231ps_avx512vl(auVar53,auVar112,local_140);
          auVar107 = auVar189._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,auVar107);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,local_c0);
          auVar91 = vfmadd231ps_fma(auVar102,auVar100,local_e0);
          auVar109 = auVar191._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar109);
          auVar108 = auVar190._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar108);
          auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar85 * 4 + lVar24);
          auVar110 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar85 * 4);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar101,local_a0);
          auVar102 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar85 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar85 * 4);
          auVar104 = vmulps_avx512vl(local_160,auVar103);
          auVar98 = vmulps_avx512vl(local_180,auVar103);
          auVar54._4_4_ = auVar103._4_4_ * (float)local_1a0._4_4_;
          auVar54._0_4_ = auVar103._0_4_ * (float)local_1a0._0_4_;
          auVar54._8_4_ = auVar103._8_4_ * fStack_198;
          auVar54._12_4_ = auVar103._12_4_ * fStack_194;
          auVar54._16_4_ = auVar103._16_4_ * fStack_190;
          auVar54._20_4_ = auVar103._20_4_ * fStack_18c;
          auVar54._24_4_ = auVar103._24_4_ * fStack_188;
          auVar54._28_4_ = uStack_184;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_100);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_120);
          auVar95 = vfmadd231ps_avx512vl(auVar54,auVar102,local_140);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar107);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_c0);
          auVar90 = vfmadd231ps_fma(auVar95,auVar110,local_e0);
          auVar95 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar109);
          auVar96 = vfmadd231ps_avx512vl(auVar98,auVar111,auVar108);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,local_a0);
          auVar97 = vmaxps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar90));
          auVar104 = vsubps_avx(auVar95,auVar99);
          auVar98 = vsubps_avx(auVar96,auVar94);
          auVar105 = vmulps_avx512vl(auVar94,auVar104);
          auVar106 = vmulps_avx512vl(auVar99,auVar98);
          auVar105 = vsubps_avx512vl(auVar105,auVar106);
          auVar106 = vmulps_avx512vl(auVar98,auVar98);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar104);
          auVar97 = vmulps_avx512vl(auVar97,auVar97);
          auVar97 = vmulps_avx512vl(auVar97,auVar106);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          uVar142 = vcmpps_avx512vl(auVar105,auVar97,2);
          local_310 = (byte)uVar23 & (byte)uVar142;
          if (local_310 == 0) {
            auVar174 = ZEXT3264(local_5e0);
            auVar150 = ZEXT3264(local_600);
            auVar186 = ZEXT3264(auVar108);
            auVar189 = ZEXT3264(auVar107);
          }
          else {
            auVar103 = vmulps_avx512vl(local_460,auVar103);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_200,auVar103);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_1e0,auVar102);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_1c0,auVar110);
            auVar113 = vmulps_avx512vl(local_460,auVar113);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_200,auVar113);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_1e0,auVar112);
            auVar110 = vfmadd213ps_avx512vl(auVar101,local_1c0,auVar100);
            auVar101 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar85 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar85 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar85 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar85 * 4);
            auVar102 = vmulps_avx512vl(local_160,auVar113);
            auVar103 = vmulps_avx512vl(local_180,auVar113);
            auVar113 = vmulps_avx512vl(local_460,auVar113);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,local_100);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_120);
            auVar112 = vfmadd231ps_avx512vl(auVar113,local_200,auVar112);
            auVar113 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar107);
            auVar102 = vfmadd231ps_avx512vl(auVar103,auVar100,local_c0);
            auVar100 = vfmadd231ps_avx512vl(auVar112,local_1e0,auVar100);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar101,auVar109);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar100,local_1c0,auVar101);
            auVar101 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar85 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar85 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar85 * 4);
            auVar97 = vmulps_avx512vl(local_160,auVar112);
            auVar105 = vmulps_avx512vl(local_180,auVar112);
            auVar112 = vmulps_avx512vl(local_460,auVar112);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_100);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_120);
            auVar112 = vfmadd231ps_avx512vl(auVar112,local_200,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar85 * 4);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar107);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_c0);
            auVar100 = vfmadd231ps_avx512vl(auVar112,local_1e0,auVar100);
            auVar112 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar109);
            auVar97 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar108);
            auVar100 = vfmadd231ps_avx512vl(auVar100,local_1c0,auVar101);
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar105);
            vandps_avx512vl(auVar102,auVar105);
            auVar101 = vmaxps_avx(auVar105,auVar105);
            vandps_avx512vl(auVar103,auVar105);
            auVar101 = vmaxps_avx(auVar101,auVar105);
            auVar74._4_4_ = fStack_3fc;
            auVar74._0_4_ = local_400;
            auVar74._8_4_ = fStack_3f8;
            auVar74._12_4_ = fStack_3f4;
            auVar74._16_4_ = fStack_3f0;
            auVar74._20_4_ = fStack_3ec;
            auVar74._24_4_ = fStack_3e8;
            auVar74._28_4_ = fStack_3e4;
            uVar78 = vcmpps_avx512vl(auVar101,auVar74,1);
            bVar16 = (bool)((byte)uVar78 & 1);
            auVar124._0_4_ = (float)((uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar113._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar113._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar113._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar113._12_4_);
            bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar113._16_4_);
            bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar113._20_4_);
            bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar113._24_4_);
            bVar16 = SUB81(uVar78 >> 7,0);
            auVar124._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar113._28_4_;
            bVar16 = (bool)((byte)uVar78 & 1);
            auVar125._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar102._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar102._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar102._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar102._12_4_);
            bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar102._16_4_);
            bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar102._20_4_);
            bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar102._24_4_);
            bVar16 = SUB81(uVar78 >> 7,0);
            auVar125._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar102._28_4_;
            vandps_avx512vl(auVar112,auVar105);
            vandps_avx512vl(auVar97,auVar105);
            auVar101 = vmaxps_avx(auVar125,auVar125);
            vandps_avx512vl(auVar100,auVar105);
            auVar101 = vmaxps_avx(auVar101,auVar125);
            uVar78 = vcmpps_avx512vl(auVar101,auVar74,1);
            bVar16 = (bool)((byte)uVar78 & 1);
            auVar126._0_4_ = (uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar112._0_4_;
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar112._4_4_;
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar112._8_4_;
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar112._12_4_;
            bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar126._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar112._16_4_;
            bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar126._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar112._20_4_;
            bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar126._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar112._24_4_;
            bVar16 = SUB81(uVar78 >> 7,0);
            auVar126._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar112._28_4_;
            bVar16 = (bool)((byte)uVar78 & 1);
            auVar127._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar97._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar97._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar97._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar97._12_4_);
            bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar97._16_4_);
            bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar97._20_4_);
            bVar16 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar97._24_4_);
            bVar16 = SUB81(uVar78 >> 7,0);
            auVar127._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar97._28_4_;
            auVar179._8_4_ = 0x80000000;
            auVar179._0_8_ = 0x8000000080000000;
            auVar179._12_4_ = 0x80000000;
            auVar179._16_4_ = 0x80000000;
            auVar179._20_4_ = 0x80000000;
            auVar179._24_4_ = 0x80000000;
            auVar179._28_4_ = 0x80000000;
            auVar101 = vxorps_avx512vl(auVar126,auVar179);
            auVar97 = auVar193._0_32_;
            auVar100 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar97);
            auVar143 = vfmadd231ps_fma(auVar100,auVar125,auVar125);
            auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar143));
            auVar188._8_4_ = 0xbf000000;
            auVar188._0_8_ = 0xbf000000bf000000;
            auVar188._12_4_ = 0xbf000000;
            auVar188._16_4_ = 0xbf000000;
            auVar188._20_4_ = 0xbf000000;
            auVar188._24_4_ = 0xbf000000;
            auVar188._28_4_ = 0xbf000000;
            fVar152 = auVar100._0_4_;
            fVar147 = auVar100._4_4_;
            fVar167 = auVar100._8_4_;
            fVar168 = auVar100._12_4_;
            fVar169 = auVar100._16_4_;
            fVar162 = auVar100._20_4_;
            fVar87 = auVar100._24_4_;
            auVar55._4_4_ = fVar147 * fVar147 * fVar147 * auVar143._4_4_ * -0.5;
            auVar55._0_4_ = fVar152 * fVar152 * fVar152 * auVar143._0_4_ * -0.5;
            auVar55._8_4_ = fVar167 * fVar167 * fVar167 * auVar143._8_4_ * -0.5;
            auVar55._12_4_ = fVar168 * fVar168 * fVar168 * auVar143._12_4_ * -0.5;
            auVar55._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar55._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar55._24_4_ = fVar87 * fVar87 * fVar87 * -0.0;
            auVar55._28_4_ = auVar125._28_4_;
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar100 = vfmadd231ps_avx512vl(auVar55,auVar112,auVar100);
            auVar56._4_4_ = auVar125._4_4_ * auVar100._4_4_;
            auVar56._0_4_ = auVar125._0_4_ * auVar100._0_4_;
            auVar56._8_4_ = auVar125._8_4_ * auVar100._8_4_;
            auVar56._12_4_ = auVar125._12_4_ * auVar100._12_4_;
            auVar56._16_4_ = auVar125._16_4_ * auVar100._16_4_;
            auVar56._20_4_ = auVar125._20_4_ * auVar100._20_4_;
            auVar56._24_4_ = auVar125._24_4_ * auVar100._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar100._4_4_ * -auVar124._4_4_;
            auVar57._0_4_ = auVar100._0_4_ * -auVar124._0_4_;
            auVar57._8_4_ = auVar100._8_4_ * -auVar124._8_4_;
            auVar57._12_4_ = auVar100._12_4_ * -auVar124._12_4_;
            auVar57._16_4_ = auVar100._16_4_ * -auVar124._16_4_;
            auVar57._20_4_ = auVar100._20_4_ * -auVar124._20_4_;
            auVar57._24_4_ = auVar100._24_4_ * -auVar124._24_4_;
            auVar57._28_4_ = auVar125._28_4_;
            auVar113 = vmulps_avx512vl(auVar100,auVar97);
            auVar100 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar97);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar127,auVar127);
            auVar102 = vrsqrt14ps_avx512vl(auVar100);
            auVar100 = vmulps_avx512vl(auVar100,auVar188);
            fVar152 = auVar102._0_4_;
            fVar147 = auVar102._4_4_;
            fVar167 = auVar102._8_4_;
            fVar168 = auVar102._12_4_;
            fVar169 = auVar102._16_4_;
            fVar162 = auVar102._20_4_;
            fVar87 = auVar102._24_4_;
            auVar58._4_4_ = fVar147 * fVar147 * fVar147 * auVar100._4_4_;
            auVar58._0_4_ = fVar152 * fVar152 * fVar152 * auVar100._0_4_;
            auVar58._8_4_ = fVar167 * fVar167 * fVar167 * auVar100._8_4_;
            auVar58._12_4_ = fVar168 * fVar168 * fVar168 * auVar100._12_4_;
            auVar58._16_4_ = fVar169 * fVar169 * fVar169 * auVar100._16_4_;
            auVar58._20_4_ = fVar162 * fVar162 * fVar162 * auVar100._20_4_;
            auVar58._24_4_ = fVar87 * fVar87 * fVar87 * auVar100._24_4_;
            auVar58._28_4_ = auVar100._28_4_;
            auVar100 = vfmadd231ps_avx512vl(auVar58,auVar112,auVar102);
            auVar59._4_4_ = auVar127._4_4_ * auVar100._4_4_;
            auVar59._0_4_ = auVar127._0_4_ * auVar100._0_4_;
            auVar59._8_4_ = auVar127._8_4_ * auVar100._8_4_;
            auVar59._12_4_ = auVar127._12_4_ * auVar100._12_4_;
            auVar59._16_4_ = auVar127._16_4_ * auVar100._16_4_;
            auVar59._20_4_ = auVar127._20_4_ * auVar100._20_4_;
            auVar59._24_4_ = auVar127._24_4_ * auVar100._24_4_;
            auVar59._28_4_ = auVar102._28_4_;
            auVar60._4_4_ = auVar100._4_4_ * auVar101._4_4_;
            auVar60._0_4_ = auVar100._0_4_ * auVar101._0_4_;
            auVar60._8_4_ = auVar100._8_4_ * auVar101._8_4_;
            auVar60._12_4_ = auVar100._12_4_ * auVar101._12_4_;
            auVar60._16_4_ = auVar100._16_4_ * auVar101._16_4_;
            auVar60._20_4_ = auVar100._20_4_ * auVar101._20_4_;
            auVar60._24_4_ = auVar100._24_4_ * auVar101._24_4_;
            auVar60._28_4_ = auVar101._28_4_;
            auVar101 = vmulps_avx512vl(auVar100,auVar97);
            auVar143 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar91),auVar99);
            auVar100 = ZEXT1632(auVar91);
            auVar9 = vfmadd213ps_fma(auVar57,auVar100,auVar94);
            auVar112 = vfmadd213ps_avx512vl(auVar113,auVar100,auVar110);
            auVar102 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar90),auVar95);
            auVar12 = vfnmadd213ps_fma(auVar56,auVar100,auVar99);
            auVar103 = ZEXT1632(auVar90);
            auVar192 = vfmadd213ps_fma(auVar60,auVar103,auVar96);
            auVar92 = vfnmadd213ps_fma(auVar57,auVar100,auVar94);
            auVar89 = vfmadd213ps_fma(auVar101,auVar103,auVar111);
            auVar94 = ZEXT1632(auVar91);
            auVar175 = vfnmadd231ps_fma(auVar110,auVar94,auVar113);
            auVar153 = vfnmadd213ps_fma(auVar59,auVar103,auVar95);
            auVar154 = vfnmadd213ps_fma(auVar60,auVar103,auVar96);
            auVar93 = vfnmadd231ps_fma(auVar111,ZEXT1632(auVar90),auVar101);
            auVar111 = vsubps_avx512vl(auVar102,ZEXT1632(auVar12));
            auVar101 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar92));
            auVar100 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar175));
            auVar61._4_4_ = auVar101._4_4_ * auVar175._4_4_;
            auVar61._0_4_ = auVar101._0_4_ * auVar175._0_4_;
            auVar61._8_4_ = auVar101._8_4_ * auVar175._8_4_;
            auVar61._12_4_ = auVar101._12_4_ * auVar175._12_4_;
            auVar61._16_4_ = auVar101._16_4_ * 0.0;
            auVar61._20_4_ = auVar101._20_4_ * 0.0;
            auVar61._24_4_ = auVar101._24_4_ * 0.0;
            auVar61._28_4_ = auVar113._28_4_;
            auVar91 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar92),auVar100);
            auVar62._4_4_ = auVar100._4_4_ * auVar12._4_4_;
            auVar62._0_4_ = auVar100._0_4_ * auVar12._0_4_;
            auVar62._8_4_ = auVar100._8_4_ * auVar12._8_4_;
            auVar62._12_4_ = auVar100._12_4_ * auVar12._12_4_;
            auVar62._16_4_ = auVar100._16_4_ * 0.0;
            auVar62._20_4_ = auVar100._20_4_ * 0.0;
            auVar62._24_4_ = auVar100._24_4_ * 0.0;
            auVar62._28_4_ = auVar100._28_4_;
            auVar10 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar175),auVar111);
            auVar63._4_4_ = auVar92._4_4_ * auVar111._4_4_;
            auVar63._0_4_ = auVar92._0_4_ * auVar111._0_4_;
            auVar63._8_4_ = auVar92._8_4_ * auVar111._8_4_;
            auVar63._12_4_ = auVar92._12_4_ * auVar111._12_4_;
            auVar63._16_4_ = auVar111._16_4_ * 0.0;
            auVar63._20_4_ = auVar111._20_4_ * 0.0;
            auVar63._24_4_ = auVar111._24_4_ * 0.0;
            auVar63._28_4_ = auVar111._28_4_;
            auVar11 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar12),auVar101);
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar97,ZEXT1632(auVar10));
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,ZEXT1632(auVar91));
            uVar78 = vcmpps_avx512vl(auVar101,auVar97,2);
            bVar79 = (byte)uVar78;
            fVar133 = (float)((uint)(bVar79 & 1) * auVar143._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * auVar153._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            fVar135 = (float)((uint)bVar16 * auVar143._4_4_ | (uint)!bVar16 * auVar153._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            fVar138 = (float)((uint)bVar16 * auVar143._8_4_ | (uint)!bVar16 * auVar153._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            fVar139 = (float)((uint)bVar16 * auVar143._12_4_ | (uint)!bVar16 * auVar153._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar133))));
            fVar134 = (float)((uint)(bVar79 & 1) * auVar9._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * auVar154._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            fVar137 = (float)((uint)bVar16 * auVar9._4_4_ | (uint)!bVar16 * auVar154._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            fVar136 = (float)((uint)bVar16 * auVar9._8_4_ | (uint)!bVar16 * auVar154._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            fVar140 = (float)((uint)bVar16 * auVar9._12_4_ | (uint)!bVar16 * auVar154._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
            auVar128._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar93._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar93._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar93._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar93._12_4_);
            fVar167 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar112._16_4_);
            auVar128._16_4_ = fVar167;
            fVar152 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar112._20_4_);
            auVar128._20_4_ = fVar152;
            fVar147 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar112._24_4_);
            auVar128._24_4_ = fVar147;
            iVar1 = (uint)(byte)(uVar78 >> 7) * auVar112._28_4_;
            auVar128._28_4_ = iVar1;
            auVar101 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar102);
            auVar129._0_4_ =
                 (uint)(bVar79 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar91._0_4_;
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar91._4_4_;
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar91._8_4_;
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar91._12_4_;
            auVar129._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_;
            auVar129._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_;
            auVar129._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_;
            auVar129._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
            auVar101 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar192));
            auVar130._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar143._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar143._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar143._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar143._12_4_);
            fVar168 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
            auVar130._16_4_ = fVar168;
            fVar169 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
            auVar130._20_4_ = fVar169;
            fVar162 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
            auVar130._24_4_ = fVar162;
            auVar130._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
            auVar101 = vblendmps_avx512vl(ZEXT1632(auVar175),ZEXT1632(auVar89));
            auVar131._0_4_ =
                 (float)((uint)(bVar79 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar9._0_4_);
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar9._4_4_);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar9._8_4_);
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar9._12_4_);
            fVar87 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
            auVar131._16_4_ = fVar87;
            fVar88 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
            auVar131._20_4_ = fVar88;
            fVar151 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
            auVar131._24_4_ = fVar151;
            iVar2 = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
            auVar131._28_4_ = iVar2;
            auVar132._0_4_ =
                 (uint)(bVar79 & 1) * (int)auVar12._0_4_ |
                 (uint)!(bool)(bVar79 & 1) * auVar102._0_4_;
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar16 * (int)auVar12._4_4_ | (uint)!bVar16 * auVar102._4_4_;
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar16 * (int)auVar12._8_4_ | (uint)!bVar16 * auVar102._8_4_;
            bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar16 * (int)auVar12._12_4_ | (uint)!bVar16 * auVar102._12_4_;
            auVar132._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_;
            auVar132._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_;
            auVar132._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_;
            auVar132._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar102._28_4_;
            bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar78 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar132,auVar103);
            auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar92._12_4_ |
                                                     (uint)!bVar20 * auVar192._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar92._8_4_ |
                                                              (uint)!bVar18 * auVar192._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar92._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar192._4_4_,
                                                                       (uint)(bVar79 & 1) *
                                                                       (int)auVar92._0_4_ |
                                                                       (uint)!(bool)(bVar79 & 1) *
                                                                       auVar192._0_4_)))),auVar104);
            auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar175._12_4_ |
                                                     (uint)!bVar21 * auVar89._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar175._8_4_ |
                                                              (uint)!bVar19 * auVar89._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar175._4_4_ |
                                                                       (uint)!bVar17 * auVar89._4_4_
                                                                       ,(uint)(bVar79 & 1) *
                                                                        (int)auVar175._0_4_ |
                                                                        (uint)!(bool)(bVar79 & 1) *
                                                                        auVar89._0_4_)))),auVar128);
            auVar113 = vsubps_avx(auVar103,auVar129);
            auVar111 = vsubps_avx(auVar104,auVar130);
            auVar110 = vsubps_avx(auVar128,auVar131);
            auVar64._4_4_ = auVar112._4_4_ * fVar135;
            auVar64._0_4_ = auVar112._0_4_ * fVar133;
            auVar64._8_4_ = auVar112._8_4_ * fVar138;
            auVar64._12_4_ = auVar112._12_4_ * fVar139;
            auVar64._16_4_ = auVar112._16_4_ * 0.0;
            auVar64._20_4_ = auVar112._20_4_ * 0.0;
            auVar64._24_4_ = auVar112._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar64,auVar128,auVar102);
            auVar161._0_4_ = fVar134 * auVar102._0_4_;
            auVar161._4_4_ = fVar137 * auVar102._4_4_;
            auVar161._8_4_ = fVar136 * auVar102._8_4_;
            auVar161._12_4_ = fVar140 * auVar102._12_4_;
            auVar161._16_4_ = auVar102._16_4_ * 0.0;
            auVar161._20_4_ = auVar102._20_4_ * 0.0;
            auVar161._24_4_ = auVar102._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar143 = vfmsub231ps_fma(auVar161,auVar103,auVar100);
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar143),auVar97,ZEXT1632(auVar91));
            auVar165._0_4_ = auVar100._0_4_ * auVar128._0_4_;
            auVar165._4_4_ = auVar100._4_4_ * auVar128._4_4_;
            auVar165._8_4_ = auVar100._8_4_ * auVar128._8_4_;
            auVar165._12_4_ = auVar100._12_4_ * auVar128._12_4_;
            auVar165._16_4_ = auVar100._16_4_ * fVar167;
            auVar165._20_4_ = auVar100._20_4_ * fVar152;
            auVar165._24_4_ = auVar100._24_4_ * fVar147;
            auVar165._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar165,auVar104,auVar112);
            auVar98 = vfmadd231ps_avx512vl(auVar101,auVar97,ZEXT1632(auVar91));
            auVar101 = vmulps_avx512vl(auVar110,auVar129);
            auVar101 = vfmsub231ps_avx512vl(auVar101,auVar113,auVar131);
            auVar65._4_4_ = auVar111._4_4_ * auVar131._4_4_;
            auVar65._0_4_ = auVar111._0_4_ * auVar131._0_4_;
            auVar65._8_4_ = auVar111._8_4_ * auVar131._8_4_;
            auVar65._12_4_ = auVar111._12_4_ * auVar131._12_4_;
            auVar65._16_4_ = auVar111._16_4_ * fVar87;
            auVar65._20_4_ = auVar111._20_4_ * fVar88;
            auVar65._24_4_ = auVar111._24_4_ * fVar151;
            auVar65._28_4_ = iVar2;
            auVar91 = vfmsub231ps_fma(auVar65,auVar130,auVar110);
            auVar166._0_4_ = auVar130._0_4_ * auVar113._0_4_;
            auVar166._4_4_ = auVar130._4_4_ * auVar113._4_4_;
            auVar166._8_4_ = auVar130._8_4_ * auVar113._8_4_;
            auVar166._12_4_ = auVar130._12_4_ * auVar113._12_4_;
            auVar166._16_4_ = fVar168 * auVar113._16_4_;
            auVar166._20_4_ = fVar169 * auVar113._20_4_;
            auVar166._24_4_ = fVar162 * auVar113._24_4_;
            auVar166._28_4_ = 0;
            auVar143 = vfmsub231ps_fma(auVar166,auVar111,auVar129);
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar143),auVar97,auVar101);
            auVar99 = vfmadd231ps_avx512vl(auVar101,auVar97,ZEXT1632(auVar91));
            auVar101 = vmaxps_avx(auVar98,auVar99);
            uVar142 = vcmpps_avx512vl(auVar101,auVar97,2);
            local_310 = local_310 & (byte)uVar142;
            auVar186 = ZEXT3264(auVar108);
            if (local_310 == 0) {
LAB_01dbef40:
              local_310 = 0;
            }
            else {
              auVar66._4_4_ = auVar110._4_4_ * auVar100._4_4_;
              auVar66._0_4_ = auVar110._0_4_ * auVar100._0_4_;
              auVar66._8_4_ = auVar110._8_4_ * auVar100._8_4_;
              auVar66._12_4_ = auVar110._12_4_ * auVar100._12_4_;
              auVar66._16_4_ = auVar110._16_4_ * auVar100._16_4_;
              auVar66._20_4_ = auVar110._20_4_ * auVar100._20_4_;
              auVar66._24_4_ = auVar110._24_4_ * auVar100._24_4_;
              auVar66._28_4_ = auVar101._28_4_;
              auVar9 = vfmsub231ps_fma(auVar66,auVar111,auVar112);
              auVar67._4_4_ = auVar112._4_4_ * auVar113._4_4_;
              auVar67._0_4_ = auVar112._0_4_ * auVar113._0_4_;
              auVar67._8_4_ = auVar112._8_4_ * auVar113._8_4_;
              auVar67._12_4_ = auVar112._12_4_ * auVar113._12_4_;
              auVar67._16_4_ = auVar112._16_4_ * auVar113._16_4_;
              auVar67._20_4_ = auVar112._20_4_ * auVar113._20_4_;
              auVar67._24_4_ = auVar112._24_4_ * auVar113._24_4_;
              auVar67._28_4_ = auVar112._28_4_;
              auVar143 = vfmsub231ps_fma(auVar67,auVar102,auVar110);
              auVar68._4_4_ = auVar111._4_4_ * auVar102._4_4_;
              auVar68._0_4_ = auVar111._0_4_ * auVar102._0_4_;
              auVar68._8_4_ = auVar111._8_4_ * auVar102._8_4_;
              auVar68._12_4_ = auVar111._12_4_ * auVar102._12_4_;
              auVar68._16_4_ = auVar111._16_4_ * auVar102._16_4_;
              auVar68._20_4_ = auVar111._20_4_ * auVar102._20_4_;
              auVar68._24_4_ = auVar111._24_4_ * auVar102._24_4_;
              auVar68._28_4_ = auVar111._28_4_;
              auVar192 = vfmsub231ps_fma(auVar68,auVar113,auVar100);
              auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar143),ZEXT1632(auVar192));
              auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar9),auVar97);
              auVar100 = vrcp14ps_avx512vl(auVar101);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar112 = vfnmadd213ps_avx512vl(auVar100,auVar101,auVar30);
              auVar91 = vfmadd132ps_fma(auVar112,auVar100,auVar100);
              auVar69._4_4_ = auVar192._4_4_ * auVar128._4_4_;
              auVar69._0_4_ = auVar192._0_4_ * auVar128._0_4_;
              auVar69._8_4_ = auVar192._8_4_ * auVar128._8_4_;
              auVar69._12_4_ = auVar192._12_4_ * auVar128._12_4_;
              auVar69._16_4_ = fVar167 * 0.0;
              auVar69._20_4_ = fVar152 * 0.0;
              auVar69._24_4_ = fVar147 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar143 = vfmadd231ps_fma(auVar69,auVar104,ZEXT1632(auVar143));
              auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar103,ZEXT1632(auVar9));
              fVar147 = auVar91._0_4_;
              fVar167 = auVar91._4_4_;
              fVar168 = auVar91._8_4_;
              fVar169 = auVar91._12_4_;
              auVar100 = ZEXT1632(CONCAT412(auVar143._12_4_ * fVar169,
                                            CONCAT48(auVar143._8_4_ * fVar168,
                                                     CONCAT44(auVar143._4_4_ * fVar167,
                                                              auVar143._0_4_ * fVar147))));
              auVar75._4_4_ = uStack_29c;
              auVar75._0_4_ = local_2a0;
              auVar75._8_4_ = uStack_298;
              auVar75._12_4_ = uStack_294;
              auVar75._16_4_ = uStack_290;
              auVar75._20_4_ = uStack_28c;
              auVar75._24_4_ = uStack_288;
              auVar75._28_4_ = uStack_284;
              uVar142 = vcmpps_avx512vl(auVar100,auVar75,0xd);
              fVar152 = local_640->tfar;
              auVar31._4_4_ = fVar152;
              auVar31._0_4_ = fVar152;
              auVar31._8_4_ = fVar152;
              auVar31._12_4_ = fVar152;
              auVar31._16_4_ = fVar152;
              auVar31._20_4_ = fVar152;
              auVar31._24_4_ = fVar152;
              auVar31._28_4_ = fVar152;
              uVar23 = vcmpps_avx512vl(auVar100,auVar31,2);
              local_310 = (byte)uVar142 & (byte)uVar23 & local_310;
              if (local_310 == 0) goto LAB_01dbef40;
              uVar142 = vcmpps_avx512vl(auVar101,auVar97,4);
              if ((local_310 & (byte)uVar142) == 0) {
                local_310 = 0;
              }
              else {
                local_310 = local_310 & (byte)uVar142;
                fVar152 = auVar98._0_4_ * fVar147;
                fVar162 = auVar98._4_4_ * fVar167;
                auVar70._4_4_ = fVar162;
                auVar70._0_4_ = fVar152;
                fVar87 = auVar98._8_4_ * fVar168;
                auVar70._8_4_ = fVar87;
                fVar88 = auVar98._12_4_ * fVar169;
                auVar70._12_4_ = fVar88;
                fVar151 = auVar98._16_4_ * 0.0;
                auVar70._16_4_ = fVar151;
                fVar133 = auVar98._20_4_ * 0.0;
                auVar70._20_4_ = fVar133;
                fVar134 = auVar98._24_4_ * 0.0;
                auVar70._24_4_ = fVar134;
                auVar70._28_4_ = auVar98._28_4_;
                fVar147 = auVar99._0_4_ * fVar147;
                fVar167 = auVar99._4_4_ * fVar167;
                auVar71._4_4_ = fVar167;
                auVar71._0_4_ = fVar147;
                fVar168 = auVar99._8_4_ * fVar168;
                auVar71._8_4_ = fVar168;
                fVar169 = auVar99._12_4_ * fVar169;
                auVar71._12_4_ = fVar169;
                fVar135 = auVar99._16_4_ * 0.0;
                auVar71._16_4_ = fVar135;
                fVar137 = auVar99._20_4_ * 0.0;
                auVar71._20_4_ = fVar137;
                fVar138 = auVar99._24_4_ * 0.0;
                auVar71._24_4_ = fVar138;
                auVar71._28_4_ = auVar99._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = &DAT_3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar101 = vsubps_avx512vl(auVar173,auVar70);
                bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar78 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar78 >> 6) & 1);
                bVar22 = SUB81(uVar78 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar22 * auVar98._28_4_ |
                                              (uint)!bVar22 * auVar101._28_4_,
                                              CONCAT424((uint)bVar21 * (int)fVar134 |
                                                        (uint)!bVar21 * auVar101._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar133 |
                                                                  (uint)!bVar20 * auVar101._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar151 |
                                                                            (uint)!bVar19 *
                                                                            auVar101._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar88 |
                                                                                      (uint)!bVar18
                                                                                      * auVar101.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar87 |
                                                                  (uint)!bVar17 * auVar101._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar162 |
                                                                           (uint)!bVar16 *
                                                                           auVar101._4_4_,
                                                                           (uint)(bVar79 & 1) *
                                                                           (int)fVar152 |
                                                                           (uint)!(bool)(bVar79 & 1)
                                                                           * auVar101._0_4_))))))));
                auVar101 = vsubps_avx(auVar173,auVar71);
                bVar16 = (bool)((byte)(uVar78 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar78 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar78 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar78 >> 6) & 1);
                bVar22 = SUB81(uVar78 >> 7,0);
                local_280._4_4_ = (uint)bVar16 * (int)fVar167 | (uint)!bVar16 * auVar101._4_4_;
                local_280._0_4_ =
                     (uint)(bVar79 & 1) * (int)fVar147 | (uint)!(bool)(bVar79 & 1) * auVar101._0_4_;
                local_280._8_4_ = (uint)bVar17 * (int)fVar168 | (uint)!bVar17 * auVar101._8_4_;
                local_280._12_4_ = (uint)bVar18 * (int)fVar169 | (uint)!bVar18 * auVar101._12_4_;
                local_280._16_4_ = (uint)bVar19 * (int)fVar135 | (uint)!bVar19 * auVar101._16_4_;
                local_280._20_4_ = (uint)bVar20 * (int)fVar137 | (uint)!bVar20 * auVar101._20_4_;
                local_280._24_4_ = (uint)bVar21 * (int)fVar138 | (uint)!bVar21 * auVar101._24_4_;
                local_280._28_4_ = (uint)bVar22 * auVar99._28_4_ | (uint)!bVar22 * auVar101._28_4_;
                in_ZMM21 = ZEXT3264(auVar100);
              }
            }
            auVar189 = ZEXT3264(local_500);
            auVar174 = ZEXT3264(local_5e0);
            auVar150 = ZEXT3264(local_600);
            if (local_310 != 0) {
              auVar101 = vsubps_avx(ZEXT1632(auVar90),auVar94);
              local_480 = in_ZMM20._0_32_;
              auVar101 = vfmadd213ps_avx512vl(auVar101,local_480,auVar94);
              auVar145._0_4_ = auVar101._0_4_ + auVar101._0_4_;
              auVar145._4_4_ = auVar101._4_4_ + auVar101._4_4_;
              auVar145._8_4_ = auVar101._8_4_ + auVar101._8_4_;
              auVar145._12_4_ = auVar101._12_4_ + auVar101._12_4_;
              auVar145._16_4_ = auVar101._16_4_ + auVar101._16_4_;
              auVar145._20_4_ = auVar101._20_4_ + auVar101._20_4_;
              auVar145._24_4_ = auVar101._24_4_ + auVar101._24_4_;
              auVar145._28_4_ = auVar101._28_4_ + auVar101._28_4_;
              fVar152 = local_618->depth_scale;
              auVar32._4_4_ = fVar152;
              auVar32._0_4_ = fVar152;
              auVar32._8_4_ = fVar152;
              auVar32._12_4_ = fVar152;
              auVar32._16_4_ = fVar152;
              auVar32._20_4_ = fVar152;
              auVar32._24_4_ = fVar152;
              auVar32._28_4_ = fVar152;
              auVar101 = vmulps_avx512vl(auVar145,auVar32);
              local_4a0 = in_ZMM21._0_32_;
              uVar142 = vcmpps_avx512vl(local_4a0,auVar101,6);
              local_310 = local_310 & (byte)uVar142;
              if (local_310 != 0) {
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3a0 = vfmadd132ps_avx512vl(local_280,auVar146,auVar33);
                local_280 = local_3a0;
                auVar101 = local_280;
                local_360 = (undefined4)lVar85;
                local_350 = local_630;
                local_340 = local_510;
                uStack_338 = uStack_508;
                local_330 = local_520;
                uStack_328 = uStack_518;
                local_320 = local_4d0;
                uStack_318 = uStack_4c8;
                pGVar82 = (local_638->scene->geometries).items[local_608].ptr;
                if ((pGVar82->mask & local_640->mask) == 0) {
                  bVar79 = 0;
                }
                else if ((local_638->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar79 = 1, pGVar82->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar100 = vaddps_avx512vl(local_480,_DAT_02020f40);
                  auVar91 = vcvtsi2ss_avx512f(auVar190._0_16_,local_360);
                  fVar152 = auVar91._0_4_;
                  local_300[0] = (fVar152 + auVar100._0_4_) * local_3e0;
                  local_300[1] = (fVar152 + auVar100._4_4_) * (float)auStack_3dc._0_4_;
                  local_300[2] = (fVar152 + auVar100._8_4_) * (float)auStack_3dc._4_4_;
                  local_300[3] = (fVar152 + auVar100._12_4_) * fStack_3d4;
                  fStack_2f0 = (fVar152 + auVar100._16_4_) * fStack_3d0;
                  fStack_2ec = (fVar152 + auVar100._20_4_) * fStack_3cc;
                  fStack_2e8 = (fVar152 + auVar100._24_4_) * fStack_3c8;
                  fStack_2e4 = fVar152 + auVar100._28_4_;
                  local_280._0_8_ = local_3a0._0_8_;
                  local_280._8_8_ = local_3a0._8_8_;
                  local_280._16_8_ = local_3a0._16_8_;
                  local_280._24_8_ = local_3a0._24_8_;
                  local_2e0 = local_280._0_8_;
                  uStack_2d8 = local_280._8_8_;
                  uStack_2d0 = local_280._16_8_;
                  uStack_2c8 = local_280._24_8_;
                  local_2c0 = local_4a0;
                  local_210 = local_510;
                  uStack_208 = uStack_508;
                  lVar80 = 0;
                  uVar81 = (ulong)local_310;
                  for (uVar78 = uVar81; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000
                      ) {
                    lVar80 = lVar80 + 1;
                  }
                  local_220 = local_520;
                  uStack_218 = uStack_518;
                  local_230 = local_4d0;
                  uStack_228 = uStack_4c8;
                  local_550 = CONCAT44(local_550._4_4_,1);
                  local_540 = pGVar82;
                  local_3c0 = local_480;
                  local_380 = local_4a0;
                  local_35c = iVar14;
                  local_280 = auVar101;
                  do {
                    local_584 = local_300[lVar80];
                    local_580 = *(undefined4 *)((long)&local_2e0 + lVar80 * 4);
                    local_4e0 = local_640->tfar;
                    local_530._0_8_ = lVar80;
                    local_640->tfar = *(float *)(local_2c0 + lVar80 * 4);
                    local_5c0.context = local_638->user;
                    fVar152 = 1.0 - local_584;
                    auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(local_584 * (fVar152 + fVar152))),
                                              ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
                    auVar143 = ZEXT416((uint)local_584);
                    auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                              ZEXT416(0xc0a00000));
                    auVar90 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584 * 3.0)),
                                              ZEXT416((uint)(local_584 + local_584)),auVar91);
                    auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                              ZEXT416(0x40000000));
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * -3.0)),
                                              ZEXT416((uint)(fVar152 + fVar152)),auVar91);
                    auVar143 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584)),auVar143,
                                               ZEXT416((uint)(fVar152 * -2.0)));
                    fVar152 = auVar9._0_4_ * 0.5;
                    fVar147 = auVar90._0_4_ * 0.5;
                    fVar167 = auVar91._0_4_ * 0.5;
                    fVar168 = auVar143._0_4_ * 0.5;
                    auVar157._0_4_ = fVar168 * (float)local_230;
                    auVar157._4_4_ = fVar168 * local_230._4_4_;
                    auVar157._8_4_ = fVar168 * (float)uStack_228;
                    auVar157._12_4_ = fVar168 * uStack_228._4_4_;
                    auVar171._4_4_ = fVar167;
                    auVar171._0_4_ = fVar167;
                    auVar171._8_4_ = fVar167;
                    auVar171._12_4_ = fVar167;
                    auVar76._8_8_ = uStack_218;
                    auVar76._0_8_ = local_220;
                    auVar91 = vfmadd132ps_fma(auVar171,auVar157,auVar76);
                    auVar158._4_4_ = fVar147;
                    auVar158._0_4_ = fVar147;
                    auVar158._8_4_ = fVar147;
                    auVar158._12_4_ = fVar147;
                    auVar77._8_8_ = uStack_208;
                    auVar77._0_8_ = local_210;
                    auVar91 = vfmadd132ps_fma(auVar158,auVar91,auVar77);
                    auVar149._4_4_ = fVar152;
                    auVar149._0_4_ = fVar152;
                    auVar149._8_4_ = fVar152;
                    auVar149._12_4_ = fVar152;
                    auVar91 = vfmadd213ps_fma(auVar149,local_630,auVar91);
                    local_590 = vmovlps_avx(auVar91);
                    local_588 = vextractps_avx(auVar91,2);
                    local_57c = (undefined4)local_558;
                    local_578 = (undefined4)local_608;
                    local_574 = (local_5c0.context)->instID[0];
                    local_570 = (local_5c0.context)->instPrimID[0];
                    local_644 = -1;
                    local_5c0.valid = &local_644;
                    local_5c0.geometryUserPtr = pGVar82->userPtr;
                    local_5c0.hit = (RTCHitN *)&local_590;
                    local_5c0.N = 1;
                    local_610 = uVar81;
                    local_5c0.ray = (RTCRayN *)local_640;
                    if ((pGVar82->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar82->occlusionFilterN)(&local_5c0), pGVar82 = local_540,
                       *local_5c0.valid != 0)) {
                      auVar91 = auVar193._0_16_;
                      p_Var15 = local_638->args->filter;
                      if (p_Var15 == (RTCFilterFunctionN)0x0) break;
                      if (((local_638->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar82->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var15)(&local_5c0);
                        pGVar82 = local_540;
                      }
                      auVar91 = auVar193._0_16_;
                      if (*local_5c0.valid != 0) break;
                    }
                    auVar91 = auVar193._0_16_;
                    local_640->tfar = local_4e0;
                    lVar80 = 0;
                    uVar81 = local_610 ^ 1L << (local_530._0_8_ & 0x3f);
                    for (uVar78 = uVar81; (uVar78 & 1) == 0;
                        uVar78 = uVar78 >> 1 | 0x8000000000000000) {
                      lVar80 = lVar80 + 1;
                    }
                    local_550 = CONCAT44(local_550._4_4_,(int)CONCAT71(local_530._1_7_,uVar81 != 0))
                    ;
                  } while (uVar81 != 0);
                  bVar79 = (byte)local_550 & 1;
                  auVar91 = vxorps_avx512vl(auVar91,auVar91);
                  auVar193 = ZEXT1664(auVar91);
                  auVar174 = ZEXT3264(local_5e0);
                  in_ZMM20 = ZEXT3264(local_480);
                  auVar150 = ZEXT3264(local_600);
                  in_ZMM21 = ZEXT3264(local_4a0);
                  auVar191 = ZEXT3264(local_420);
                  auVar186 = ZEXT3264(local_440);
                  auVar189 = ZEXT3264(local_500);
                }
                bVar86 = (bool)(bVar86 | bVar79);
              }
            }
          }
          lVar85 = lVar85 + 8;
          auVar190 = auVar186;
        } while ((int)lVar85 < iVar14);
      }
      if (bVar86 != false) {
        return local_649;
      }
      fVar152 = local_640->tfar;
      auVar29._4_4_ = fVar152;
      auVar29._0_4_ = fVar152;
      auVar29._8_4_ = fVar152;
      auVar29._12_4_ = fVar152;
      auVar29._16_4_ = fVar152;
      auVar29._20_4_ = fVar152;
      auVar29._24_4_ = fVar152;
      auVar29._28_4_ = fVar152;
      uVar142 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar83 = (uint)uVar84 & (uint)uVar142;
      uVar84 = (ulong)uVar83;
      local_649 = uVar83 != 0;
      context = local_638;
      ray = local_640;
      pre = local_618;
    } while (local_649);
  }
  return local_649;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }